

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  size_t k;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  uint uVar49;
  RTCIntersectArguments *pRVar50;
  undefined1 (*pauVar51) [32];
  ulong uVar52;
  ulong uVar53;
  ulong *puVar54;
  uint uVar55;
  NodeRef root;
  long lVar56;
  bool bVar57;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar80;
  float fVar81;
  float fVar84;
  float fVar87;
  undefined1 auVar77 [32];
  float fVar82;
  float fVar85;
  float fVar88;
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar78 [32];
  float fVar83;
  float fVar86;
  float fVar89;
  float fVar91;
  float fVar93;
  undefined1 in_ZMM1 [64];
  undefined1 auVar79 [64];
  undefined1 extraout_var [56];
  float fVar95;
  float fVar106;
  float fVar107;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar108;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar118;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar146;
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [64];
  float fVar150;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  float fVar165;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  float fVar191;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar203;
  undefined1 auVar204 [32];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar205 [64];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 in_ZMM11 [64];
  float fVar219;
  undefined1 auVar220 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 in_ZMM12 [64];
  float fVar227;
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d31;
  ulong local_2d30;
  RayQueryContext *local_2d28;
  RTCIntersectArguments *local_2d20;
  Intersectors *local_2d18;
  RayK<8> *local_2d10;
  ulong local_2d08;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [8];
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  RayK<8> *pRStack_2ca8;
  undefined8 local_2ca0;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float local_2c80 [4];
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  ulong local_2c50;
  ulong local_2c48;
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 local_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [8];
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined4 local_2b00;
  undefined4 uStack_2afc;
  undefined4 uStack_2af8;
  undefined4 uStack_2af4;
  undefined4 uStack_2af0;
  undefined4 uStack_2aec;
  undefined4 uStack_2ae8;
  undefined4 uStack_2ae4;
  uint local_2ae0;
  uint uStack_2adc;
  uint uStack_2ad8;
  uint uStack_2ad4;
  uint uStack_2ad0;
  uint uStack_2acc;
  uint uStack_2ac8;
  uint uStack_2ac4;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a80;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  float local_2780;
  float fStack_277c;
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  undefined4 uStack_2764;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar76 [32];
  undefined1 auVar196 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar77 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar96 = ZEXT816(0) << 0x40;
    auVar58 = vpcmpeqd_avx2(auVar77,(undefined1  [32])valid_i->field_0);
    auVar77 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar96),5);
    auVar73 = auVar58 & auVar77;
    if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar73 >> 0x7f,0) != '\0') ||
          (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar73 >> 0xbf,0) != '\0') ||
        (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar73[0x1f] < '\0')
    {
      auVar77 = vandps_avx(auVar77,auVar58);
      auVar6 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
      local_2a80._0_8_ = *(undefined8 *)ray;
      local_2a80._8_8_ = *(undefined8 *)(ray + 8);
      local_2a80._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2a80._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2a80._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2a80._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2a80._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2a80._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2a80._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2a80._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2a80._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2a80._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2a20 = *(undefined1 (*) [32])(ray + 0x80);
      local_2a00 = *(undefined1 (*) [32])(ray + 0xa0);
      local_29e0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_27c0._8_4_ = 0x7fffffff;
      local_27c0._0_8_ = 0x7fffffff7fffffff;
      local_27c0._12_4_ = 0x7fffffff;
      local_27c0._16_4_ = 0x7fffffff;
      local_27c0._20_4_ = 0x7fffffff;
      local_27c0._24_4_ = 0x7fffffff;
      local_27c0._28_4_ = 0x7fffffff;
      auVar205 = ZEXT3264(local_27c0);
      auVar192._8_4_ = 0x219392ef;
      auVar192._0_8_ = 0x219392ef219392ef;
      auVar192._12_4_ = 0x219392ef;
      auVar192._16_4_ = 0x219392ef;
      auVar192._20_4_ = 0x219392ef;
      auVar192._24_4_ = 0x219392ef;
      auVar192._28_4_ = 0x219392ef;
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = &DAT_3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar236._16_4_ = 0x3f800000;
      auVar236._20_4_ = 0x3f800000;
      auVar236._24_4_ = 0x3f800000;
      auVar236._28_4_ = 0x3f800000;
      auVar109 = vdivps_avx(auVar236,local_2a20);
      auVar77 = vandps_avx(local_27c0,local_2a20);
      auVar73 = vcmpps_avx(auVar77,auVar192,1);
      auVar77 = vandps_avx(local_27c0,local_2a00);
      auVar58 = vcmpps_avx(auVar77,auVar192,1);
      auVar171 = ZEXT3264(auVar58);
      auVar110 = vdivps_avx(auVar236,local_2a00);
      auVar77 = vandps_avx(local_27c0,local_29e0);
      auVar77 = vcmpps_avx(auVar77,auVar192,1);
      auVar184 = ZEXT3264(auVar77);
      auVar119 = vdivps_avx(auVar236,local_29e0);
      auVar193._8_4_ = 0x5d5e0b6b;
      auVar193._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar193._12_4_ = 0x5d5e0b6b;
      auVar193._16_4_ = 0x5d5e0b6b;
      auVar193._20_4_ = 0x5d5e0b6b;
      auVar193._24_4_ = 0x5d5e0b6b;
      auVar193._28_4_ = 0x5d5e0b6b;
      auVar196 = ZEXT3264(auVar193);
      local_29c0 = vblendvps_avx(auVar109,auVar193,auVar73);
      local_29a0 = vblendvps_avx(auVar110,auVar193,auVar58);
      _local_2980 = vblendvps_avx(auVar119,auVar193,auVar77);
      auVar77 = vcmpps_avx(local_29c0,ZEXT1632(auVar96),1);
      auVar73._8_4_ = 0x10;
      auVar73._0_8_ = 0x1000000010;
      auVar73._12_4_ = 0x10;
      auVar73._16_4_ = 0x10;
      auVar73._20_4_ = 0x10;
      auVar73._24_4_ = 0x10;
      auVar73._28_4_ = 0x10;
      local_2960 = vandps_avx(auVar77,auVar73);
      auVar109._8_4_ = 0x20;
      auVar109._0_8_ = 0x2000000020;
      auVar109._12_4_ = 0x20;
      auVar109._16_4_ = 0x20;
      auVar109._20_4_ = 0x20;
      auVar109._24_4_ = 0x20;
      auVar109._28_4_ = 0x20;
      auVar76._8_4_ = 0x30;
      auVar76._0_8_ = 0x3000000030;
      auVar76._12_4_ = 0x30;
      auVar76._16_4_ = 0x30;
      auVar76._20_4_ = 0x30;
      auVar76._24_4_ = 0x30;
      auVar76._28_4_ = 0x30;
      auVar158 = ZEXT3264(auVar76);
      auVar73 = ZEXT1632(auVar96);
      auVar77 = vcmpps_avx(local_29a0,auVar73,5);
      local_2940 = vblendvps_avx(auVar76,auVar109,auVar77);
      auVar110._8_4_ = 0x40;
      auVar110._0_8_ = 0x4000000040;
      auVar110._12_4_ = 0x40;
      auVar110._16_4_ = 0x40;
      auVar110._20_4_ = 0x40;
      auVar110._24_4_ = 0x40;
      auVar110._28_4_ = 0x40;
      auVar119._8_4_ = 0x50;
      auVar119._0_8_ = 0x5000000050;
      auVar119._12_4_ = 0x50;
      auVar119._16_4_ = 0x50;
      auVar119._20_4_ = 0x50;
      auVar119._24_4_ = 0x50;
      auVar119._28_4_ = 0x50;
      auVar77 = vcmpps_avx(_local_2980,auVar73,5);
      auVar143 = ZEXT3264(auVar77);
      local_2920 = vblendvps_avx(auVar119,auVar110,auVar77);
      auVar77 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar73);
      auVar73 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar73);
      local_28c0 = vpmovsxwd_avx2(auVar6);
      auVar128 = ZEXT3264(local_28c0);
      auVar58._8_4_ = 0x7f800000;
      auVar58._0_8_ = 0x7f8000007f800000;
      auVar58._12_4_ = 0x7f800000;
      auVar58._16_4_ = 0x7f800000;
      auVar58._20_4_ = 0x7f800000;
      auVar58._24_4_ = 0x7f800000;
      auVar58._28_4_ = 0x7f800000;
      local_2900 = vblendvps_avx(auVar58,auVar77,local_28c0);
      auVar77._8_4_ = 0xff800000;
      auVar77._0_8_ = 0xff800000ff800000;
      auVar77._12_4_ = 0xff800000;
      auVar77._16_4_ = 0xff800000;
      auVar77._20_4_ = 0xff800000;
      auVar77._24_4_ = 0xff800000;
      auVar77._28_4_ = 0xff800000;
      local_28e0 = vblendvps_avx(auVar77,auVar73,local_28c0);
      auVar96 = vpcmpeqd_avx(local_28e0._0_16_,local_28e0._0_16_);
      local_2c40 = vpmovsxwd_avx2(auVar6 ^ auVar96);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar53 = 5;
        pRVar50 = (RTCIntersectArguments *)context;
      }
      else {
        pRVar50 = (RTCIntersectArguments *)
                  (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT);
        uVar53 = (long)pRVar50 * 3 + 2;
      }
      local_2d10 = ray + 0x100;
      puVar54 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar51 = (undefined1 (*) [32])local_1e40;
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar79 = ZEXT3264(local_1e80);
      local_2608 = (bvh->root).ptr;
      local_1e60 = local_2900;
      local_2d28 = context;
      local_2d18 = This;
      do {
        pauVar51 = pauVar51 + -1;
        root.ptr = puVar54[-1];
        puVar54 = puVar54 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_005b22af:
          iVar45 = 3;
        }
        else {
          local_2d00 = *pauVar51;
          auVar240 = ZEXT3264(local_2d00);
          auVar77 = vcmpps_avx(local_2d00,local_28e0,1);
          if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar77 >> 0x7f,0) == '\0') &&
                (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0xbf,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar77[0x1f]) {
LAB_005b22c0:
            iVar45 = 2;
          }
          else {
            uVar48 = vmovmskps_avx(auVar77);
            pRVar50 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar48);
            iVar45 = 0;
            if ((uint)POPCOUNT(uVar48) <= uVar53) {
              while (pRVar50 != (RTCIntersectArguments *)0x0) {
                local_2c00._0_8_ = pRVar50;
                k = 0;
                for (; ((ulong)pRVar50 & 1) == 0;
                    pRVar50 = (RTCIntersectArguments *)((ulong)pRVar50 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                auVar79 = ZEXT1664(auVar79._0_16_);
                auVar128 = ZEXT1664(auVar128._0_16_);
                auVar143 = ZEXT1664(auVar143._0_16_);
                auVar158 = ZEXT1664(auVar158._0_16_);
                auVar171 = ZEXT1664(auVar171._0_16_);
                auVar184 = ZEXT1664(auVar184._0_16_);
                auVar196 = ZEXT1664(auVar196._0_16_);
                auVar205 = ZEXT1664(auVar205._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                bVar57 = occluded1(local_2d18,bvh,root,k,&local_2d31,ray,
                                   (TravRayK<8,_true> *)&local_2a80.field_0,local_2d28);
                if (bVar57) {
                  *(undefined4 *)(local_2c40 + k * 4) = 0xffffffff;
                }
                auVar240 = ZEXT3264(local_2d00);
                pRVar50 = (RTCIntersectArguments *)(local_2c00._0_8_ - 1 & local_2c00._0_8_);
              }
              auVar77 = _DAT_0205a980 & ~local_2c40;
              iVar45 = 3;
              pRVar50 = (RTCIntersectArguments *)0x0;
              if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar77 >> 0x7f,0) != '\0') ||
                    (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0xbf,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar77[0x1f] < '\0') {
                auVar79 = ZEXT3264(local_28e0);
                auVar105._8_4_ = 0xff800000;
                auVar105._0_8_ = 0xff800000ff800000;
                auVar105._12_4_ = 0xff800000;
                auVar105._16_4_ = 0xff800000;
                auVar105._20_4_ = 0xff800000;
                auVar105._24_4_ = 0xff800000;
                auVar105._28_4_ = 0xff800000;
                local_28e0 = vblendvps_avx(local_28e0,auVar105,local_2c40);
                iVar45 = 2;
              }
            }
            if ((uint)uVar53 < (uint)POPCOUNT(uVar48)) {
              do {
                uVar55 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  auVar77 = vpcmpeqd_avx2(auVar79._0_32_,auVar79._0_32_);
                  auVar79 = ZEXT3264(auVar77);
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_005b22af;
                  auVar73 = vcmpps_avx(local_28e0,auVar240._0_32_,6);
                  if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar73 >> 0x7f,0) != '\0') ||
                        (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar73 >> 0xbf,0) != '\0') ||
                      (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar73[0x1f] < '\0') {
                    local_2c50 = (ulong)(uVar55 & 0xf) - 8;
                    auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
                    auVar63 = local_2c40;
                    if (local_2c50 != 0) {
                      uVar47 = 0;
                      auVar77 = local_2c40 ^ auVar77;
                      do {
                        auVar73 = auVar77;
                        auVar79 = ZEXT3264(auVar73);
                        lVar56 = uVar47 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                        uVar49 = vmovmskps_avx(auVar73);
                        local_2d30 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar49);
                        uVar55 = 0;
                        for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x80000000) {
                          uVar55 = uVar55 + 1;
                        }
                        local_2c48 = (ulong)uVar55;
                        pRVar50 = (RTCIntersectArguments *)0x0;
                        for (uVar46 = local_2d30; (uVar46 & 1) == 0;
                            uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                          pRVar50 = (RTCIntersectArguments *)((long)&pRVar50->flags + 1);
                        }
                        local_2c20 = auVar73;
                        uVar46 = 0;
                        local_2d20 = pRVar50;
                        local_2d08 = uVar47;
                        while( true ) {
                          auVar58 = auVar79._0_32_;
                          fVar71 = auVar184._28_4_;
                          fVar81 = auVar196._28_4_;
                          if (*(int *)(lVar56 + 0x40 + uVar46 * 4) == -1) break;
                          local_2c00 = auVar73;
                          pRVar2 = (local_2d28->scene->geometries).items;
                          pGVar3 = pRVar2[*(uint *)(lVar56 + 0x30 + uVar46 * 4)].ptr;
                          fVar84 = (pGVar3->time_range).lower;
                          auVar59._4_4_ = fVar84;
                          auVar59._0_4_ = fVar84;
                          auVar59._8_4_ = fVar84;
                          auVar59._12_4_ = fVar84;
                          auVar59._16_4_ = fVar84;
                          auVar59._20_4_ = fVar84;
                          auVar59._24_4_ = fVar84;
                          auVar59._28_4_ = fVar84;
                          auVar77 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar59);
                          fVar84 = (pGVar3->time_range).upper - fVar84;
                          auVar60._4_4_ = fVar84;
                          auVar60._0_4_ = fVar84;
                          auVar60._8_4_ = fVar84;
                          auVar60._12_4_ = fVar84;
                          auVar60._16_4_ = fVar84;
                          auVar60._20_4_ = fVar84;
                          auVar60._24_4_ = fVar84;
                          auVar60._28_4_ = fVar84;
                          auVar77 = vdivps_avx(auVar77,auVar60);
                          fVar84 = pGVar3->fnumTimeSegments;
                          auVar14._4_4_ = fVar84 * auVar77._4_4_;
                          auVar14._0_4_ = fVar84 * auVar77._0_4_;
                          auVar14._8_4_ = fVar84 * auVar77._8_4_;
                          auVar14._12_4_ = fVar84 * auVar77._12_4_;
                          auVar14._16_4_ = fVar84 * auVar77._16_4_;
                          auVar14._20_4_ = fVar84 * auVar77._20_4_;
                          auVar14._24_4_ = fVar84 * auVar77._24_4_;
                          auVar14._28_4_ = auVar77._28_4_;
                          auVar77 = vroundps_avx(auVar14,1);
                          fVar84 = fVar84 + -1.0;
                          auVar74._4_4_ = fVar84;
                          auVar74._0_4_ = fVar84;
                          auVar74._8_4_ = fVar84;
                          auVar74._12_4_ = fVar84;
                          auVar74._16_4_ = fVar84;
                          auVar74._20_4_ = fVar84;
                          auVar74._24_4_ = fVar84;
                          auVar74._28_4_ = fVar84;
                          auVar77 = vminps_avx(auVar77,auVar74);
                          auVar77 = vmaxps_avx(auVar77,_DAT_02020f00);
                          auVar73 = vsubps_avx(auVar14,auVar77);
                          local_2ce0 = vcvtps2dq_avx(auVar77);
                          fVar84 = *(float *)(local_2ce0 + local_2c48 * 4);
                          auVar99._4_4_ = fVar84;
                          auVar99._0_4_ = fVar84;
                          auVar99._8_4_ = fVar84;
                          auVar99._12_4_ = fVar84;
                          auVar99._16_4_ = fVar84;
                          auVar99._20_4_ = fVar84;
                          auVar99._24_4_ = fVar84;
                          auVar99._28_4_ = fVar84;
                          auVar77 = vpcmpeqd_avx2(auVar99,local_2ce0);
                          auVar58 = auVar58 & ~auVar77;
                          fVar87 = auVar73._0_4_;
                          fVar64 = auVar73._4_4_;
                          fVar66 = auVar73._12_4_;
                          fVar67 = auVar73._16_4_;
                          fVar68 = auVar73._20_4_;
                          fVar69 = auVar73._24_4_;
                          fVar65 = auVar73._8_4_;
                          auVar184._28_36_ = in_ZMM11._28_36_;
                          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar58 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar58 >> 0x7f,0) == '\0') &&
                                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar58 >> 0xbf,0) == '\0') &&
                              (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar58[0x1f]) {
                            lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives +
                                             (long)(int)fVar84 * 0x38);
                            lVar5 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                             (long)(int)fVar84 * 0x38);
                            uVar52 = (ulong)*(uint *)(lVar56 + uVar46 * 4);
                            uVar47 = (ulong)*(uint *)(lVar56 + 0x10 + uVar46 * 4);
                            uVar48 = *(undefined4 *)(lVar4 + uVar52 * 4);
                            auVar139._4_4_ = uVar48;
                            auVar139._0_4_ = uVar48;
                            auVar139._8_4_ = uVar48;
                            auVar139._12_4_ = uVar48;
                            auVar139._16_4_ = uVar48;
                            auVar139._20_4_ = uVar48;
                            auVar139._24_4_ = uVar48;
                            auVar139._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 4 + uVar52 * 4);
                            auVar154._4_4_ = uVar48;
                            auVar154._0_4_ = uVar48;
                            auVar154._8_4_ = uVar48;
                            auVar154._12_4_ = uVar48;
                            auVar154._16_4_ = uVar48;
                            auVar154._20_4_ = uVar48;
                            auVar154._24_4_ = uVar48;
                            auVar154._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 8 + uVar52 * 4);
                            auVar168._4_4_ = uVar48;
                            auVar168._0_4_ = uVar48;
                            auVar168._8_4_ = uVar48;
                            auVar168._12_4_ = uVar48;
                            auVar168._16_4_ = uVar48;
                            auVar168._20_4_ = uVar48;
                            auVar168._24_4_ = uVar48;
                            auVar168._28_4_ = uVar48;
                            fVar71 = *(float *)(lVar5 + uVar52 * 4);
                            fVar81 = *(float *)(lVar5 + 4 + uVar52 * 4);
                            fVar84 = *(float *)(lVar5 + 8 + uVar52 * 4);
                            auVar77 = vsubps_avx(auVar240._0_32_,auVar73);
                            auVar184._0_4_ = fVar87 * fVar71;
                            auVar184._4_4_ = fVar64 * fVar71;
                            auVar184._8_4_ = fVar65 * fVar71;
                            auVar184._12_4_ = fVar66 * fVar71;
                            auVar184._16_4_ = fVar67 * fVar71;
                            auVar184._20_4_ = fVar68 * fVar71;
                            auVar184._24_4_ = fVar69 * fVar71;
                            auVar128._0_4_ = fVar87 * fVar81;
                            auVar128._4_4_ = fVar64 * fVar81;
                            auVar128._8_4_ = fVar65 * fVar81;
                            auVar128._12_4_ = fVar66 * fVar81;
                            auVar128._16_4_ = fVar67 * fVar81;
                            auVar128._20_4_ = fVar68 * fVar81;
                            auVar128._28_36_ = auVar240._28_36_;
                            auVar128._24_4_ = fVar69 * fVar81;
                            auVar15._4_4_ = fVar64 * fVar84;
                            auVar15._0_4_ = fVar87 * fVar84;
                            auVar15._8_4_ = fVar65 * fVar84;
                            auVar15._12_4_ = fVar66 * fVar84;
                            auVar15._16_4_ = fVar67 * fVar84;
                            auVar15._20_4_ = fVar68 * fVar84;
                            auVar15._24_4_ = fVar69 * fVar84;
                            auVar15._28_4_ = fVar84;
                            auVar96 = vfmadd231ps_fma(auVar184._0_32_,auVar77,auVar139);
                            auVar6 = vfmadd231ps_fma(auVar128._0_32_,auVar77,auVar154);
                            auVar239 = ZEXT1632(auVar6);
                            uVar48 = *(undefined4 *)(lVar4 + uVar47 * 4);
                            auVar180._4_4_ = uVar48;
                            auVar180._0_4_ = uVar48;
                            auVar180._8_4_ = uVar48;
                            auVar180._12_4_ = uVar48;
                            auVar180._16_4_ = uVar48;
                            auVar180._20_4_ = uVar48;
                            auVar180._24_4_ = uVar48;
                            auVar180._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 4 + uVar47 * 4);
                            auVar194._4_4_ = uVar48;
                            auVar194._0_4_ = uVar48;
                            auVar194._8_4_ = uVar48;
                            auVar194._12_4_ = uVar48;
                            auVar194._16_4_ = uVar48;
                            auVar194._20_4_ = uVar48;
                            auVar194._24_4_ = uVar48;
                            auVar194._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 8 + uVar47 * 4);
                            auVar204._4_4_ = uVar48;
                            auVar204._0_4_ = uVar48;
                            auVar204._8_4_ = uVar48;
                            auVar204._12_4_ = uVar48;
                            auVar204._16_4_ = uVar48;
                            auVar204._20_4_ = uVar48;
                            auVar204._24_4_ = uVar48;
                            auVar204._28_4_ = uVar48;
                            fVar84 = *(float *)(lVar5 + uVar47 * 4);
                            fVar72 = *(float *)(lVar5 + 4 + uVar47 * 4);
                            auVar6 = vfmadd231ps_fma(auVar15,auVar77,auVar168);
                            auVar127 = ZEXT1632(auVar6);
                            fVar82 = *(float *)(lVar5 + 8 + uVar47 * 4);
                            auVar16._4_4_ = fVar64 * fVar84;
                            auVar16._0_4_ = fVar87 * fVar84;
                            auVar16._8_4_ = fVar65 * fVar84;
                            auVar16._12_4_ = fVar66 * fVar84;
                            auVar16._16_4_ = fVar67 * fVar84;
                            auVar16._20_4_ = fVar68 * fVar84;
                            auVar16._24_4_ = fVar69 * fVar84;
                            auVar16._28_4_ = fVar71;
                            auVar142 = ZEXT1632(auVar96);
                            auVar17._4_4_ = fVar64 * fVar72;
                            auVar17._0_4_ = fVar87 * fVar72;
                            auVar17._8_4_ = fVar65 * fVar72;
                            auVar17._12_4_ = fVar66 * fVar72;
                            auVar17._16_4_ = fVar67 * fVar72;
                            auVar17._20_4_ = fVar68 * fVar72;
                            auVar17._24_4_ = fVar69 * fVar72;
                            auVar17._28_4_ = fVar72;
                            auVar18._4_4_ = fVar64 * fVar82;
                            auVar18._0_4_ = fVar87 * fVar82;
                            auVar18._8_4_ = fVar65 * fVar82;
                            auVar18._12_4_ = fVar66 * fVar82;
                            auVar18._16_4_ = fVar67 * fVar82;
                            auVar18._20_4_ = fVar68 * fVar82;
                            auVar18._24_4_ = fVar69 * fVar82;
                            auVar18._28_4_ = fVar81;
                            auVar96 = vfmadd231ps_fma(auVar16,auVar77,auVar180);
                            auVar102 = ZEXT1632(auVar96);
                            auVar96 = vfmadd231ps_fma(auVar17,auVar77,auVar194);
                            auVar157 = ZEXT1632(auVar96);
                            auVar96 = vfmadd231ps_fma(auVar18,auVar77,auVar204);
                            auVar114 = ZEXT1632(auVar96);
                            uVar47 = (ulong)*(uint *)(lVar56 + 0x20 + uVar46 * 4);
                            uVar48 = *(undefined4 *)(lVar4 + uVar47 * 4);
                            auVar195._4_4_ = uVar48;
                            auVar195._0_4_ = uVar48;
                            auVar195._8_4_ = uVar48;
                            auVar195._12_4_ = uVar48;
                            auVar195._16_4_ = uVar48;
                            auVar195._20_4_ = uVar48;
                            auVar195._24_4_ = uVar48;
                            auVar195._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 4 + uVar47 * 4);
                            auVar220._4_4_ = uVar48;
                            auVar220._0_4_ = uVar48;
                            auVar220._8_4_ = uVar48;
                            auVar220._12_4_ = uVar48;
                            auVar220._16_4_ = uVar48;
                            auVar220._20_4_ = uVar48;
                            auVar220._24_4_ = uVar48;
                            auVar220._28_4_ = uVar48;
                            uVar48 = *(undefined4 *)(lVar4 + 8 + uVar47 * 4);
                            auVar228._4_4_ = uVar48;
                            auVar228._0_4_ = uVar48;
                            auVar228._8_4_ = uVar48;
                            auVar228._12_4_ = uVar48;
                            auVar228._16_4_ = uVar48;
                            auVar228._20_4_ = uVar48;
                            auVar228._24_4_ = uVar48;
                            auVar228._28_4_ = uVar48;
                            fVar71 = *(float *)(lVar5 + uVar47 * 4);
                            fVar81 = *(float *)(lVar5 + 4 + uVar47 * 4);
                            fVar84 = *(float *)(lVar5 + 8 + uVar47 * 4);
                            auVar19._4_4_ = fVar71 * fVar64;
                            auVar19._0_4_ = fVar71 * fVar87;
                            auVar19._8_4_ = fVar71 * fVar65;
                            auVar19._12_4_ = fVar71 * fVar66;
                            auVar19._16_4_ = fVar71 * fVar67;
                            auVar19._20_4_ = fVar71 * fVar68;
                            auVar19._24_4_ = fVar71 * fVar69;
                            auVar19._28_4_ = fVar71;
                            auVar20._4_4_ = fVar81 * fVar64;
                            auVar20._0_4_ = fVar81 * fVar87;
                            auVar20._8_4_ = fVar81 * fVar65;
                            auVar20._12_4_ = fVar81 * fVar66;
                            auVar20._16_4_ = fVar81 * fVar67;
                            auVar20._20_4_ = fVar81 * fVar68;
                            auVar20._24_4_ = fVar81 * fVar69;
                            auVar20._28_4_ = fVar81;
                            auVar21._4_4_ = fVar84 * fVar64;
                            auVar21._0_4_ = fVar84 * fVar87;
                            auVar21._8_4_ = fVar84 * fVar65;
                            auVar21._12_4_ = fVar84 * fVar66;
                            auVar21._16_4_ = fVar84 * fVar67;
                            auVar21._20_4_ = fVar84 * fVar68;
                            auVar21._24_4_ = fVar84 * fVar69;
                            auVar21._28_4_ = fVar84;
                            auVar96 = vfmadd231ps_fma(auVar19,auVar77,auVar195);
                            auVar183 = ZEXT1632(auVar96);
                            auVar96 = vfmadd231ps_fma(auVar20,auVar77,auVar220);
                            auVar128 = ZEXT1664(auVar96);
                            auVar96 = vfmadd231ps_fma(auVar21,auVar77,auVar228);
                            auVar143 = ZEXT1664(auVar96);
                          }
                          else {
                            if (local_2d30 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar52 = (ulong)*(uint *)(lVar56 + uVar46 * 4);
                              uVar47 = local_2d30;
                              pRVar50 = local_2d20;
                              do {
                                auVar96 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2ce0 +
                                                                            (long)pRVar50 * 4) *
                                                              0x38) + uVar52 * 4);
                                auVar6 = *(undefined1 (*) [16])
                                          (*(long *)(lVar4 + 0x38 +
                                                    (long)*(int *)(local_2ce0 + (long)pRVar50 * 4) *
                                                    0x38) + uVar52 * 4);
                                fVar84 = 0.0;
                                *(int *)((long)&local_2ba0 + (long)pRVar50 * 4) = auVar96._0_4_;
                                uVar48 = vextractps_avx(auVar96,1);
                                *(undefined4 *)((long)&local_2b80 + (long)pRVar50 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar96,2);
                                *(undefined4 *)(local_2b60 + (long)pRVar50 * 4) = uVar48;
                                *(int *)(local_2cc0 + (long)pRVar50 * 4) = auVar6._0_4_;
                                *(int *)((long)&local_2ca0 + (long)pRVar50 * 4) = auVar6._4_4_;
                                local_2c80[(long)pRVar50] = auVar6._8_4_;
                                uVar47 = uVar47 ^ 1L << ((ulong)pRVar50 & 0x3f);
                                pRVar50 = (RTCIntersectArguments *)0x0;
                                for (uVar7 = uVar47; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  pRVar50 = (RTCIntersectArguments *)((long)&pRVar50->flags + 1);
                                }
                              } while (uVar47 != 0);
                            }
                            auVar77 = vsubps_avx(auVar240._0_32_,auVar73);
                            fVar72 = auVar77._0_4_;
                            fVar95 = fVar72 * (float)local_2ba0;
                            fVar82 = auVar77._4_4_;
                            fVar106 = fVar82 * local_2ba0._4_4_;
                            fVar85 = auVar77._8_4_;
                            fVar107 = fVar85 * (float)uStack_2b98;
                            fVar88 = auVar77._12_4_;
                            fVar108 = fVar88 * uStack_2b98._4_4_;
                            fVar90 = auVar77._16_4_;
                            fVar70 = fVar90 * (float)uStack_2b90;
                            fVar92 = auVar77._20_4_;
                            fVar80 = fVar92 * uStack_2b90._4_4_;
                            fVar94 = auVar77._24_4_;
                            fVar83 = fVar94 * (float)uStack_2b88;
                            fVar86 = fVar72 * (float)local_2b80;
                            fVar89 = fVar82 * local_2b80._4_4_;
                            fVar91 = fVar85 * (float)uStack_2b78;
                            fVar93 = fVar88 * uStack_2b78._4_4_;
                            fVar115 = fVar90 * (float)uStack_2b70;
                            fVar116 = fVar92 * uStack_2b70._4_4_;
                            fVar117 = fVar94 * (float)uStack_2b68;
                            fVar118 = fVar72 * (float)local_2b60._0_4_;
                            fVar129 = fVar82 * (float)local_2b60._4_4_;
                            fVar130 = fVar85 * fStack_2b58;
                            fVar131 = fVar88 * fStack_2b54;
                            fVar132 = fVar90 * fStack_2b50;
                            fVar133 = fVar92 * fStack_2b4c;
                            fVar134 = fVar94 * fStack_2b48;
                            fVar135 = fVar87 * (float)local_2cc0._0_4_;
                            fVar144 = fVar64 * (float)local_2cc0._4_4_;
                            fVar145 = fVar65 * (float)uStack_2cb8;
                            fVar146 = fVar66 * uStack_2cb8._4_4_;
                            fVar147 = fVar67 * (float)uStack_2cb0;
                            fVar148 = fVar68 * uStack_2cb0._4_4_;
                            fVar149 = fVar69 * pRStack_2ca8._0_4_;
                            fVar150 = fVar87 * (float)local_2ca0;
                            fVar159 = fVar64 * local_2ca0._4_4_;
                            fVar160 = fVar65 * fStack_2c98;
                            fVar161 = fVar66 * fStack_2c94;
                            fVar162 = fVar67 * fStack_2c90;
                            fVar163 = fVar68 * fStack_2c8c;
                            fVar164 = fVar69 * fStack_2c88;
                            fVar165 = fVar87 * local_2c80[0];
                            fVar172 = fVar64 * local_2c80[1];
                            fVar173 = fVar65 * local_2c80[2];
                            fVar174 = fVar66 * local_2c80[3];
                            fVar175 = fVar67 * fStack_2c70;
                            fVar176 = fVar68 * fStack_2c6c;
                            fVar177 = fVar69 * fStack_2c68;
                            if (local_2d30 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar52 = (ulong)*(uint *)(lVar56 + 0x10 + uVar46 * 4);
                              uVar47 = local_2d30;
                              pRVar50 = local_2d20;
                              do {
                                auVar96 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2ce0 +
                                                                            (long)pRVar50 * 4) *
                                                              0x38) + uVar52 * 4);
                                fVar71 = 0.0;
                                auVar6 = *(undefined1 (*) [16])
                                          (*(long *)(lVar4 + 0x38 +
                                                    (long)*(int *)(local_2ce0 + (long)pRVar50 * 4) *
                                                    0x38) + uVar52 * 4);
                                fVar81 = 0.0;
                                *(int *)((long)&local_2ba0 + (long)pRVar50 * 4) = auVar96._0_4_;
                                uVar48 = vextractps_avx(auVar96,1);
                                *(undefined4 *)((long)&local_2b80 + (long)pRVar50 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar96,2);
                                *(undefined4 *)(local_2b60 + (long)pRVar50 * 4) = uVar48;
                                *(int *)(local_2cc0 + (long)pRVar50 * 4) = auVar6._0_4_;
                                uVar48 = vextractps_avx(auVar6,1);
                                *(undefined4 *)((long)&local_2ca0 + (long)pRVar50 * 4) = uVar48;
                                fVar178 = (float)vextractps_avx(auVar6,2);
                                local_2c80[(long)pRVar50] = fVar178;
                                uVar47 = uVar47 ^ 1L << ((ulong)pRVar50 & 0x3f);
                                pRVar50 = (RTCIntersectArguments *)0x0;
                                for (uVar7 = uVar47; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  pRVar50 = (RTCIntersectArguments *)((long)&pRVar50->flags + 1);
                                }
                              } while (uVar47 != 0);
                            }
                            fVar203 = fVar72 * (float)local_2ba0;
                            fVar206 = fVar82 * local_2ba0._4_4_;
                            fVar207 = fVar85 * (float)uStack_2b98;
                            fVar208 = fVar88 * uStack_2b98._4_4_;
                            fVar209 = fVar90 * (float)uStack_2b90;
                            fVar210 = fVar92 * uStack_2b90._4_4_;
                            fVar211 = fVar94 * (float)uStack_2b88;
                            fVar212 = fVar72 * (float)local_2b80;
                            fVar213 = fVar82 * local_2b80._4_4_;
                            fVar214 = fVar85 * (float)uStack_2b78;
                            fVar215 = fVar88 * uStack_2b78._4_4_;
                            fVar216 = fVar90 * (float)uStack_2b70;
                            fVar217 = fVar92 * uStack_2b70._4_4_;
                            fVar218 = fVar94 * (float)uStack_2b68;
                            fVar178 = fVar72 * (float)local_2b60._0_4_;
                            fVar185 = fVar82 * (float)local_2b60._4_4_;
                            fVar186 = fVar85 * fStack_2b58;
                            fVar187 = fVar88 * fStack_2b54;
                            fVar188 = fVar90 * fStack_2b50;
                            fVar189 = fVar92 * fStack_2b4c;
                            fVar190 = fVar94 * fStack_2b48;
                            fVar219 = fVar87 * (float)local_2cc0._0_4_;
                            fVar221 = fVar64 * (float)local_2cc0._4_4_;
                            fVar222 = fVar65 * (float)uStack_2cb8;
                            fVar223 = fVar66 * uStack_2cb8._4_4_;
                            fVar224 = fVar67 * (float)uStack_2cb0;
                            fVar225 = fVar68 * uStack_2cb0._4_4_;
                            fVar226 = fVar69 * pRStack_2ca8._0_4_;
                            fVar227 = fVar87 * (float)local_2ca0;
                            fVar229 = fVar64 * local_2ca0._4_4_;
                            fVar230 = fVar65 * fStack_2c98;
                            fVar231 = fVar66 * fStack_2c94;
                            fVar232 = fVar67 * fStack_2c90;
                            fVar233 = fVar68 * fStack_2c8c;
                            fVar234 = fVar69 * fStack_2c88;
                            fVar191 = fVar87 * local_2c80[0];
                            fVar197 = fVar64 * local_2c80[1];
                            fVar198 = fVar65 * local_2c80[2];
                            fVar199 = fVar66 * local_2c80[3];
                            fVar200 = fVar67 * fStack_2c70;
                            fVar201 = fVar68 * fStack_2c6c;
                            fVar202 = fVar69 * fStack_2c68;
                            if (local_2d30 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar52 = (ulong)*(uint *)(lVar56 + 0x20 + uVar46 * 4);
                              uVar47 = local_2d30;
                              pRVar50 = local_2d20;
                              do {
                                auVar96 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2ce0 +
                                                                            (long)pRVar50 * 4) *
                                                              0x38) + uVar52 * 4);
                                auVar6 = *(undefined1 (*) [16])
                                          (*(long *)(lVar4 + 0x38 +
                                                    (long)*(int *)(local_2ce0 + (long)pRVar50 * 4) *
                                                    0x38) + uVar52 * 4);
                                *(int *)((long)&local_2ba0 + (long)pRVar50 * 4) = auVar96._0_4_;
                                uVar48 = vextractps_avx(auVar96,1);
                                *(undefined4 *)((long)&local_2b80 + (long)pRVar50 * 4) = uVar48;
                                uVar48 = vextractps_avx(auVar96,2);
                                *(undefined4 *)(local_2b60 + (long)pRVar50 * 4) = uVar48;
                                *(int *)(local_2cc0 + (long)pRVar50 * 4) = auVar6._0_4_;
                                uVar48 = vextractps_avx(auVar6,1);
                                *(undefined4 *)((long)&local_2ca0 + (long)pRVar50 * 4) = uVar48;
                                fVar1 = (float)vextractps_avx(auVar6,2);
                                local_2c80[(long)pRVar50] = fVar1;
                                uVar47 = uVar47 ^ 1L << ((ulong)pRVar50 & 0x3f);
                                pRVar50 = (RTCIntersectArguments *)0x0;
                                for (uVar7 = uVar47; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  pRVar50 = (RTCIntersectArguments *)((long)&pRVar50->flags + 1);
                                }
                              } while (uVar47 != 0);
                            }
                            auVar142._0_4_ = fVar95 + fVar135;
                            auVar142._4_4_ = fVar106 + fVar144;
                            auVar142._8_4_ = fVar107 + fVar145;
                            auVar142._12_4_ = fVar108 + fVar146;
                            auVar142._16_4_ = fVar70 + fVar147;
                            auVar142._20_4_ = fVar80 + fVar148;
                            auVar142._24_4_ = fVar83 + fVar149;
                            auVar142._28_4_ = fVar84 + auVar143._28_4_;
                            auVar239._0_4_ = fVar86 + fVar150;
                            auVar239._4_4_ = fVar89 + fVar159;
                            auVar239._8_4_ = fVar91 + fVar160;
                            auVar239._12_4_ = fVar93 + fVar161;
                            auVar239._16_4_ = fVar115 + fVar162;
                            auVar239._20_4_ = fVar116 + fVar163;
                            auVar239._24_4_ = fVar117 + fVar164;
                            auVar239._28_4_ = auVar79._28_4_ + auVar158._28_4_;
                            auVar127._0_4_ = fVar118 + fVar165;
                            auVar127._4_4_ = fVar129 + fVar172;
                            auVar127._8_4_ = fVar130 + fVar173;
                            auVar127._12_4_ = fVar131 + fVar174;
                            auVar127._16_4_ = fVar132 + fVar175;
                            auVar127._20_4_ = fVar133 + fVar176;
                            auVar127._24_4_ = fVar134 + fVar177;
                            auVar127._28_4_ = auVar128._28_4_ + auVar171._28_4_;
                            auVar102._0_4_ = fVar203 + fVar219;
                            auVar102._4_4_ = fVar206 + fVar221;
                            auVar102._8_4_ = fVar207 + fVar222;
                            auVar102._12_4_ = fVar208 + fVar223;
                            auVar102._16_4_ = fVar209 + fVar224;
                            auVar102._20_4_ = fVar210 + fVar225;
                            auVar102._24_4_ = fVar211 + fVar226;
                            auVar102._28_4_ = auVar205._28_4_ + in_ZMM12._28_4_;
                            auVar157._0_4_ = fVar212 + fVar227;
                            auVar157._4_4_ = fVar213 + fVar229;
                            auVar157._8_4_ = fVar214 + fVar230;
                            auVar157._12_4_ = fVar215 + fVar231;
                            auVar157._16_4_ = fVar216 + fVar232;
                            auVar157._20_4_ = fVar217 + fVar233;
                            auVar157._24_4_ = fVar218 + fVar234;
                            auVar157._28_4_ = in_ZMM11._28_4_ + in_ZMM13._28_4_;
                            auVar114._0_4_ = fVar178 + fVar191;
                            auVar114._4_4_ = fVar185 + fVar197;
                            auVar114._8_4_ = fVar186 + fVar198;
                            auVar114._12_4_ = fVar187 + fVar199;
                            auVar114._16_4_ = fVar188 + fVar200;
                            auVar114._20_4_ = fVar189 + fVar201;
                            auVar114._24_4_ = fVar190 + fVar202;
                            auVar114._28_4_ = fVar71 + fVar81;
                            auVar183._0_4_ =
                                 fVar72 * (float)local_2ba0 + fVar87 * (float)local_2cc0._0_4_;
                            auVar183._4_4_ =
                                 fVar82 * local_2ba0._4_4_ + fVar64 * (float)local_2cc0._4_4_;
                            auVar183._8_4_ =
                                 fVar85 * (float)uStack_2b98 + fVar65 * (float)uStack_2cb8;
                            auVar183._12_4_ =
                                 fVar88 * uStack_2b98._4_4_ + fVar66 * uStack_2cb8._4_4_;
                            auVar183._16_4_ =
                                 fVar90 * (float)uStack_2b90 + fVar67 * (float)uStack_2cb0;
                            auVar183._20_4_ =
                                 fVar92 * uStack_2b90._4_4_ + fVar68 * uStack_2cb0._4_4_;
                            auVar183._24_4_ =
                                 fVar94 * (float)uStack_2b88 + fVar69 * pRStack_2ca8._0_4_;
                            auVar183._28_4_ = auVar205._28_4_ + in_ZMM12._28_4_;
                            auVar128 = ZEXT3264(CONCAT428(in_ZMM11._28_4_ + fVar81,
                                                          CONCAT424(fVar94 * (float)uStack_2b68 +
                                                                    fVar69 * fStack_2c88,
                                                                    CONCAT420(fVar92 * uStack_2b70.
                                                                                       _4_4_ +
                                                                              fVar68 * fStack_2c8c,
                                                                              CONCAT416(fVar90 * (
                                                  float)uStack_2b70 + fVar67 * fStack_2c90,
                                                  CONCAT412(fVar88 * uStack_2b78._4_4_ +
                                                            fVar66 * fStack_2c94,
                                                            CONCAT48(fVar85 * (float)uStack_2b78 +
                                                                     fVar65 * fStack_2c98,
                                                                     CONCAT44(fVar82 * local_2b80.
                                                                                       _4_4_ +
                                                                              fVar64 * local_2ca0.
                                                                                       _4_4_,
                                                                              fVar72 * (float)
                                                  local_2b80 + fVar87 * (float)local_2ca0))))))));
                            auVar143 = ZEXT3264(CONCAT428(auVar77._28_4_ + auVar73._28_4_,
                                                          CONCAT424(fVar94 * fStack_2b48 +
                                                                    fVar69 * fStack_2c68,
                                                                    CONCAT420(fVar92 * fStack_2b4c +
                                                                              fVar68 * fStack_2c6c,
                                                                              CONCAT416(fVar90 * 
                                                  fStack_2b50 + fVar67 * fStack_2c70,
                                                  CONCAT412(fVar88 * fStack_2b54 +
                                                            fVar66 * local_2c80[3],
                                                            CONCAT48(fVar85 * fStack_2b58 +
                                                                     fVar65 * local_2c80[2],
                                                                     CONCAT44(fVar82 * (float)
                                                  local_2b60._4_4_ + fVar64 * local_2c80[1],
                                                  fVar72 * (float)local_2b60._0_4_ +
                                                  fVar87 * local_2c80[0]))))))));
                          }
                          local_2bb0 = *(undefined8 *)(lVar56 + 0x30);
                          uStack_2ba8 = *(undefined8 *)(lVar56 + 0x38);
                          local_2bc0 = *(undefined8 *)(lVar56 + 0x40);
                          uStack_2bb8 = *(undefined8 *)(lVar56 + 0x48);
                          auVar77 = *(undefined1 (*) [32])ray;
                          auVar73 = *(undefined1 (*) [32])(ray + 0x20);
                          auVar58 = *(undefined1 (*) [32])(ray + 0x40);
                          local_2640 = vsubps_avx(auVar142,auVar77);
                          local_2660 = vsubps_avx(auVar239,auVar73);
                          local_2680 = vsubps_avx(auVar127,auVar58);
                          auVar109 = vsubps_avx(auVar102,auVar77);
                          auVar110 = vsubps_avx(auVar157,auVar73);
                          auVar119 = vsubps_avx(auVar114,auVar58);
                          auVar76 = vsubps_avx(auVar183,auVar77);
                          auVar192 = vsubps_avx(auVar128._0_32_,auVar73);
                          auVar58 = vsubps_avx(auVar143._0_32_,auVar58);
                          local_26a0 = vsubps_avx(auVar76,local_2640);
                          local_26e0 = vsubps_avx(auVar192,local_2660);
                          local_26c0 = vsubps_avx(auVar58,local_2680);
                          auVar113._0_4_ = auVar76._0_4_ + local_2640._0_4_;
                          auVar113._4_4_ = auVar76._4_4_ + local_2640._4_4_;
                          auVar113._8_4_ = auVar76._8_4_ + local_2640._8_4_;
                          auVar113._12_4_ = auVar76._12_4_ + local_2640._12_4_;
                          auVar113._16_4_ = auVar76._16_4_ + local_2640._16_4_;
                          auVar113._20_4_ = auVar76._20_4_ + local_2640._20_4_;
                          auVar113._24_4_ = auVar76._24_4_ + local_2640._24_4_;
                          auVar113._28_4_ = auVar76._28_4_ + local_2640._28_4_;
                          auVar155._0_4_ = auVar192._0_4_ + local_2660._0_4_;
                          auVar155._4_4_ = auVar192._4_4_ + local_2660._4_4_;
                          auVar155._8_4_ = auVar192._8_4_ + local_2660._8_4_;
                          auVar155._12_4_ = auVar192._12_4_ + local_2660._12_4_;
                          auVar155._16_4_ = auVar192._16_4_ + local_2660._16_4_;
                          auVar155._20_4_ = auVar192._20_4_ + local_2660._20_4_;
                          auVar155._24_4_ = auVar192._24_4_ + local_2660._24_4_;
                          fVar71 = local_2660._28_4_;
                          fVar70 = auVar192._28_4_;
                          auVar155._28_4_ = fVar70 + fVar71;
                          fVar132 = local_2680._0_4_;
                          auVar181._0_4_ = fVar132 + auVar58._0_4_;
                          fVar133 = local_2680._4_4_;
                          auVar181._4_4_ = fVar133 + auVar58._4_4_;
                          fVar134 = local_2680._8_4_;
                          auVar181._8_4_ = fVar134 + auVar58._8_4_;
                          fVar135 = local_2680._12_4_;
                          auVar181._12_4_ = fVar135 + auVar58._12_4_;
                          fVar144 = local_2680._16_4_;
                          auVar181._16_4_ = fVar144 + auVar58._16_4_;
                          fVar145 = local_2680._20_4_;
                          auVar181._20_4_ = fVar145 + auVar58._20_4_;
                          fVar146 = local_2680._24_4_;
                          auVar181._24_4_ = fVar146 + auVar58._24_4_;
                          auVar181._28_4_ = local_2680._28_4_ + auVar58._28_4_;
                          auVar158._0_4_ = local_26c0._0_4_ * auVar155._0_4_;
                          auVar158._4_4_ = local_26c0._4_4_ * auVar155._4_4_;
                          auVar158._8_4_ = local_26c0._8_4_ * auVar155._8_4_;
                          auVar158._12_4_ = local_26c0._12_4_ * auVar155._12_4_;
                          auVar158._16_4_ = local_26c0._16_4_ * auVar155._16_4_;
                          auVar158._20_4_ = local_26c0._20_4_ * auVar155._20_4_;
                          auVar158._28_36_ = auVar143._28_36_;
                          auVar158._24_4_ = local_26c0._24_4_ * auVar155._24_4_;
                          auVar6 = vfmsub231ps_fma(auVar158._0_32_,local_26e0,auVar181);
                          auVar143._0_4_ = auVar181._0_4_ * local_26a0._0_4_;
                          auVar143._4_4_ = auVar181._4_4_ * local_26a0._4_4_;
                          auVar143._8_4_ = auVar181._8_4_ * local_26a0._8_4_;
                          auVar143._12_4_ = auVar181._12_4_ * local_26a0._12_4_;
                          auVar143._16_4_ = auVar181._16_4_ * local_26a0._16_4_;
                          auVar143._20_4_ = auVar181._20_4_ * local_26a0._20_4_;
                          auVar143._28_36_ = auVar128._28_36_;
                          auVar143._24_4_ = auVar181._24_4_ * local_26a0._24_4_;
                          auVar96 = vfmsub231ps_fma(auVar143._0_32_,local_26c0,auVar113);
                          auVar22._4_4_ = auVar113._4_4_ * local_26e0._4_4_;
                          auVar22._0_4_ = auVar113._0_4_ * local_26e0._0_4_;
                          auVar22._8_4_ = auVar113._8_4_ * local_26e0._8_4_;
                          auVar22._12_4_ = auVar113._12_4_ * local_26e0._12_4_;
                          auVar22._16_4_ = auVar113._16_4_ * local_26e0._16_4_;
                          auVar22._20_4_ = auVar113._20_4_ * local_26e0._20_4_;
                          auVar22._24_4_ = auVar113._24_4_ * local_26e0._24_4_;
                          auVar22._28_4_ = auVar113._28_4_;
                          auVar8 = vfmsub231ps_fma(auVar22,local_26a0,auVar155);
                          local_2be0 = *(undefined1 (*) [32])(ray + 0xc0);
                          in_ZMM14 = ZEXT3264(local_2be0);
                          fVar115 = local_2be0._0_4_;
                          fVar116 = local_2be0._4_4_;
                          auVar23._4_4_ = fVar116 * auVar8._4_4_;
                          auVar23._0_4_ = fVar115 * auVar8._0_4_;
                          fVar117 = local_2be0._8_4_;
                          auVar23._8_4_ = fVar117 * auVar8._8_4_;
                          fVar118 = local_2be0._12_4_;
                          auVar23._12_4_ = fVar118 * auVar8._12_4_;
                          fVar129 = local_2be0._16_4_;
                          auVar23._16_4_ = fVar129 * 0.0;
                          fVar130 = local_2be0._20_4_;
                          auVar23._20_4_ = fVar130 * 0.0;
                          fVar131 = local_2be0._24_4_;
                          auVar23._24_4_ = fVar131 * 0.0;
                          auVar23._28_4_ = local_26a0._28_4_;
                          auVar77 = *(undefined1 (*) [32])(ray + 0xa0);
                          auVar96 = vfmadd231ps_fma(auVar23,auVar77,ZEXT1632(auVar96));
                          auVar73 = *(undefined1 (*) [32])(ray + 0x80);
                          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar73,ZEXT1632(auVar6));
                          in_ZMM13 = ZEXT1664(auVar96);
                          local_2700 = vsubps_avx(local_2660,auVar110);
                          local_2740 = vsubps_avx(local_2680,auVar119);
                          auVar156._0_4_ = auVar110._0_4_ + local_2660._0_4_;
                          auVar156._4_4_ = auVar110._4_4_ + local_2660._4_4_;
                          auVar156._8_4_ = auVar110._8_4_ + local_2660._8_4_;
                          auVar156._12_4_ = auVar110._12_4_ + local_2660._12_4_;
                          auVar156._16_4_ = auVar110._16_4_ + local_2660._16_4_;
                          auVar156._20_4_ = auVar110._20_4_ + local_2660._20_4_;
                          auVar156._24_4_ = auVar110._24_4_ + local_2660._24_4_;
                          auVar156._28_4_ = auVar110._28_4_ + fVar71;
                          auVar237._0_4_ = fVar132 + auVar119._0_4_;
                          auVar237._4_4_ = fVar133 + auVar119._4_4_;
                          auVar237._8_4_ = fVar134 + auVar119._8_4_;
                          auVar237._12_4_ = fVar135 + auVar119._12_4_;
                          auVar237._16_4_ = fVar144 + auVar119._16_4_;
                          auVar237._20_4_ = fVar145 + auVar119._20_4_;
                          auVar237._24_4_ = fVar146 + auVar119._24_4_;
                          auVar237._28_4_ = local_2680._28_4_ + auVar119._28_4_;
                          fVar81 = local_2740._0_4_;
                          fVar87 = local_2740._4_4_;
                          auVar24._4_4_ = auVar156._4_4_ * fVar87;
                          auVar24._0_4_ = auVar156._0_4_ * fVar81;
                          fVar66 = local_2740._8_4_;
                          auVar24._8_4_ = auVar156._8_4_ * fVar66;
                          fVar69 = local_2740._12_4_;
                          auVar24._12_4_ = auVar156._12_4_ * fVar69;
                          fVar85 = local_2740._16_4_;
                          auVar24._16_4_ = auVar156._16_4_ * fVar85;
                          fVar92 = local_2740._20_4_;
                          auVar24._20_4_ = auVar156._20_4_ * fVar92;
                          fVar106 = local_2740._24_4_;
                          auVar24._24_4_ = auVar156._24_4_ * fVar106;
                          auVar24._28_4_ = fVar71;
                          auVar8 = vfmsub231ps_fma(auVar24,local_2700,auVar237);
                          local_2720 = vsubps_avx(local_2640,auVar109);
                          in_ZMM11 = ZEXT3264(local_2720);
                          fVar71 = local_2720._0_4_;
                          fVar64 = local_2720._4_4_;
                          auVar25._4_4_ = auVar237._4_4_ * fVar64;
                          auVar25._0_4_ = auVar237._0_4_ * fVar71;
                          fVar67 = local_2720._8_4_;
                          auVar25._8_4_ = auVar237._8_4_ * fVar67;
                          fVar72 = local_2720._12_4_;
                          auVar25._12_4_ = auVar237._12_4_ * fVar72;
                          fVar88 = local_2720._16_4_;
                          auVar25._16_4_ = auVar237._16_4_ * fVar88;
                          fVar94 = local_2720._20_4_;
                          auVar25._20_4_ = auVar237._20_4_ * fVar94;
                          fVar107 = local_2720._24_4_;
                          auVar25._24_4_ = auVar237._24_4_ * fVar107;
                          auVar25._28_4_ = auVar237._28_4_;
                          auVar169._0_4_ = auVar109._0_4_ + local_2640._0_4_;
                          auVar169._4_4_ = auVar109._4_4_ + local_2640._4_4_;
                          auVar169._8_4_ = auVar109._8_4_ + local_2640._8_4_;
                          auVar169._12_4_ = auVar109._12_4_ + local_2640._12_4_;
                          auVar169._16_4_ = auVar109._16_4_ + local_2640._16_4_;
                          auVar169._20_4_ = auVar109._20_4_ + local_2640._20_4_;
                          auVar169._24_4_ = auVar109._24_4_ + local_2640._24_4_;
                          auVar169._28_4_ = auVar109._28_4_ + local_2640._28_4_;
                          auVar6 = vfmsub231ps_fma(auVar25,local_2740,auVar169);
                          fVar84 = local_2700._0_4_;
                          fVar65 = local_2700._4_4_;
                          auVar26._4_4_ = auVar169._4_4_ * fVar65;
                          auVar26._0_4_ = auVar169._0_4_ * fVar84;
                          fVar68 = local_2700._8_4_;
                          auVar26._8_4_ = auVar169._8_4_ * fVar68;
                          fVar82 = local_2700._12_4_;
                          auVar26._12_4_ = auVar169._12_4_ * fVar82;
                          fVar90 = local_2700._16_4_;
                          auVar26._16_4_ = auVar169._16_4_ * fVar90;
                          fVar95 = local_2700._20_4_;
                          auVar26._20_4_ = auVar169._20_4_ * fVar95;
                          fVar108 = local_2700._24_4_;
                          auVar26._24_4_ = auVar169._24_4_ * fVar108;
                          auVar26._28_4_ = auVar169._28_4_;
                          auVar136 = vfmsub231ps_fma(auVar26,local_2720,auVar156);
                          auVar27._4_4_ = fVar116 * auVar136._4_4_;
                          auVar27._0_4_ = fVar115 * auVar136._0_4_;
                          auVar27._8_4_ = fVar117 * auVar136._8_4_;
                          auVar27._12_4_ = fVar118 * auVar136._12_4_;
                          auVar27._16_4_ = fVar129 * 0.0;
                          auVar27._20_4_ = fVar130 * 0.0;
                          auVar27._24_4_ = fVar131 * 0.0;
                          auVar27._28_4_ = auVar156._28_4_;
                          auVar6 = vfmadd231ps_fma(auVar27,auVar77,ZEXT1632(auVar6));
                          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar73,ZEXT1632(auVar8));
                          auVar158 = ZEXT1664(auVar6);
                          auVar193 = vsubps_avx(auVar109,auVar76);
                          auVar75._0_4_ = auVar109._0_4_ + auVar76._0_4_;
                          auVar75._4_4_ = auVar109._4_4_ + auVar76._4_4_;
                          auVar75._8_4_ = auVar109._8_4_ + auVar76._8_4_;
                          auVar75._12_4_ = auVar109._12_4_ + auVar76._12_4_;
                          auVar75._16_4_ = auVar109._16_4_ + auVar76._16_4_;
                          auVar75._20_4_ = auVar109._20_4_ + auVar76._20_4_;
                          auVar75._24_4_ = auVar109._24_4_ + auVar76._24_4_;
                          auVar75._28_4_ = auVar109._28_4_ + auVar76._28_4_;
                          auVar76 = vsubps_avx(auVar110,auVar192);
                          in_ZMM12 = ZEXT3264(auVar76);
                          auVar61._0_4_ = auVar110._0_4_ + auVar192._0_4_;
                          auVar61._4_4_ = auVar110._4_4_ + auVar192._4_4_;
                          auVar61._8_4_ = auVar110._8_4_ + auVar192._8_4_;
                          auVar61._12_4_ = auVar110._12_4_ + auVar192._12_4_;
                          auVar61._16_4_ = auVar110._16_4_ + auVar192._16_4_;
                          auVar61._20_4_ = auVar110._20_4_ + auVar192._20_4_;
                          auVar61._24_4_ = auVar110._24_4_ + auVar192._24_4_;
                          auVar61._28_4_ = auVar110._28_4_ + fVar70;
                          auVar192 = vsubps_avx(auVar119,auVar58);
                          auVar196 = ZEXT3264(auVar192);
                          auVar100._0_4_ = auVar119._0_4_ + auVar58._0_4_;
                          auVar100._4_4_ = auVar119._4_4_ + auVar58._4_4_;
                          auVar100._8_4_ = auVar119._8_4_ + auVar58._8_4_;
                          auVar100._12_4_ = auVar119._12_4_ + auVar58._12_4_;
                          auVar100._16_4_ = auVar119._16_4_ + auVar58._16_4_;
                          auVar100._20_4_ = auVar119._20_4_ + auVar58._20_4_;
                          auVar100._24_4_ = auVar119._24_4_ + auVar58._24_4_;
                          auVar100._28_4_ = auVar119._28_4_ + auVar58._28_4_;
                          auVar28._4_4_ = auVar192._4_4_ * auVar61._4_4_;
                          auVar28._0_4_ = auVar192._0_4_ * auVar61._0_4_;
                          auVar28._8_4_ = auVar192._8_4_ * auVar61._8_4_;
                          auVar28._12_4_ = auVar192._12_4_ * auVar61._12_4_;
                          auVar28._16_4_ = auVar192._16_4_ * auVar61._16_4_;
                          auVar28._20_4_ = auVar192._20_4_ * auVar61._20_4_;
                          auVar28._24_4_ = auVar192._24_4_ * auVar61._24_4_;
                          auVar28._28_4_ = fVar70;
                          auVar136 = vfmsub231ps_fma(auVar28,auVar76,auVar100);
                          auVar29._4_4_ = auVar193._4_4_ * auVar100._4_4_;
                          auVar29._0_4_ = auVar193._0_4_ * auVar100._0_4_;
                          auVar29._8_4_ = auVar193._8_4_ * auVar100._8_4_;
                          auVar29._12_4_ = auVar193._12_4_ * auVar100._12_4_;
                          auVar29._16_4_ = auVar193._16_4_ * auVar100._16_4_;
                          auVar29._20_4_ = auVar193._20_4_ * auVar100._20_4_;
                          auVar29._24_4_ = auVar193._24_4_ * auVar100._24_4_;
                          auVar29._28_4_ = auVar100._28_4_;
                          auVar8 = vfmsub231ps_fma(auVar29,auVar192,auVar75);
                          auVar30._4_4_ = auVar76._4_4_ * auVar75._4_4_;
                          auVar30._0_4_ = auVar76._0_4_ * auVar75._0_4_;
                          auVar30._8_4_ = auVar76._8_4_ * auVar75._8_4_;
                          auVar30._12_4_ = auVar76._12_4_ * auVar75._12_4_;
                          auVar30._16_4_ = auVar76._16_4_ * auVar75._16_4_;
                          auVar30._20_4_ = auVar76._20_4_ * auVar75._20_4_;
                          auVar30._24_4_ = auVar76._24_4_ * auVar75._24_4_;
                          auVar30._28_4_ = auVar75._28_4_;
                          auVar9 = vfmsub231ps_fma(auVar30,auVar193,auVar61);
                          auVar31._4_4_ = fVar116 * auVar9._4_4_;
                          auVar31._0_4_ = fVar115 * auVar9._0_4_;
                          auVar31._8_4_ = fVar117 * auVar9._8_4_;
                          auVar31._12_4_ = fVar118 * auVar9._12_4_;
                          auVar31._16_4_ = fVar129 * 0.0;
                          auVar31._20_4_ = fVar130 * 0.0;
                          auVar31._24_4_ = fVar131 * 0.0;
                          auVar31._28_4_ = auVar61._28_4_;
                          auVar8 = vfmadd231ps_fma(auVar31,auVar77,ZEXT1632(auVar8));
                          auVar184 = ZEXT3264(auVar73);
                          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar73,ZEXT1632(auVar136));
                          auVar136._0_8_ =
                               CONCAT44(auVar8._4_4_ + auVar96._4_4_ + auVar6._4_4_,
                                        auVar8._0_4_ + auVar96._0_4_ + auVar6._0_4_);
                          auVar136._8_4_ = auVar8._8_4_ + auVar96._8_4_ + auVar6._8_4_;
                          auVar136._12_4_ = auVar8._12_4_ + auVar96._12_4_ + auVar6._12_4_;
                          auVar105 = ZEXT1632(auVar136);
                          auVar143 = ZEXT3264(auVar105);
                          auVar205 = ZEXT3264(local_27c0);
                          auVar58 = vandps_avx(local_27c0,auVar105);
                          fVar70 = auVar58._0_4_ * 1.1920929e-07;
                          fVar80 = auVar58._4_4_ * 1.1920929e-07;
                          auVar32._4_4_ = fVar80;
                          auVar32._0_4_ = fVar70;
                          fVar83 = auVar58._8_4_ * 1.1920929e-07;
                          auVar32._8_4_ = fVar83;
                          fVar86 = auVar58._12_4_ * 1.1920929e-07;
                          auVar32._12_4_ = fVar86;
                          fVar89 = auVar58._16_4_ * 1.1920929e-07;
                          auVar32._16_4_ = fVar89;
                          fVar91 = auVar58._20_4_ * 1.1920929e-07;
                          auVar32._20_4_ = fVar91;
                          fVar93 = auVar58._24_4_ * 1.1920929e-07;
                          auVar32._24_4_ = fVar93;
                          auVar32._28_4_ = auVar58._28_4_;
                          auVar63 = ZEXT1632(auVar96);
                          auVar109 = vminps_avx(auVar63,ZEXT1632(auVar6));
                          auVar109 = vminps_avx(auVar109,ZEXT1632(auVar8));
                          auVar170._8_4_ = 0x80000000;
                          auVar170._0_8_ = 0x8000000080000000;
                          auVar170._12_4_ = 0x80000000;
                          auVar170._16_4_ = 0x80000000;
                          auVar170._20_4_ = 0x80000000;
                          auVar170._24_4_ = 0x80000000;
                          auVar170._28_4_ = 0x80000000;
                          auVar171 = ZEXT3264(auVar170);
                          auVar126._0_8_ = CONCAT44(fVar80,fVar70) ^ 0x8000000080000000;
                          auVar126._8_4_ = -fVar83;
                          auVar126._12_4_ = -fVar86;
                          auVar126._16_4_ = -fVar89;
                          auVar126._20_4_ = -fVar91;
                          auVar126._24_4_ = -fVar93;
                          auVar126._28_4_ = auVar58._28_4_ ^ 0x80000000;
                          auVar109 = vcmpps_avx(auVar109,auVar126,5);
                          auVar110 = vmaxps_avx(auVar63,ZEXT1632(auVar6));
                          auVar128 = ZEXT3264(auVar110);
                          auVar58 = vmaxps_avx(auVar110,ZEXT1632(auVar8));
                          auVar58 = vcmpps_avx(auVar58,auVar32,2);
                          auVar119 = vorps_avx(auVar109,auVar58);
                          auVar236 = local_2c00 & auVar119;
                          auVar58 = vandps_avx(auVar119,local_2c00);
                          if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar236 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar236 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar236 >> 0x7f,0) == '\0') &&
                                (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar236 >> 0xbf,0) == '\0') &&
                              (auVar236 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar236[0x1f]) {
                            auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                                          CONCAT424(0x3f800000,
                                                                    CONCAT420(0x3f800000,
                                                                              CONCAT416(0x3f800000,
                                                                                        CONCAT412(
                                                  0x3f800000,
                                                  CONCAT48(0x3f800000,&DAT_3f8000003f800000)))))));
                          }
                          else {
                            local_27a0 = auVar105;
                            local_2760 = auVar58;
                            in_ZMM14 = ZEXT3264(local_2700);
                            auVar33._4_4_ = fVar65 * local_26c0._4_4_;
                            auVar33._0_4_ = fVar84 * local_26c0._0_4_;
                            auVar33._8_4_ = fVar68 * local_26c0._8_4_;
                            auVar33._12_4_ = fVar82 * local_26c0._12_4_;
                            auVar33._16_4_ = fVar90 * local_26c0._16_4_;
                            auVar33._20_4_ = fVar95 * local_26c0._20_4_;
                            auVar33._24_4_ = fVar108 * local_26c0._24_4_;
                            auVar33._28_4_ = auVar119._28_4_;
                            local_2780 = fVar71 * local_26e0._0_4_;
                            fStack_277c = fVar64 * local_26e0._4_4_;
                            fStack_2778 = fVar67 * local_26e0._8_4_;
                            fStack_2774 = fVar72 * local_26e0._12_4_;
                            fStack_2770 = fVar88 * local_26e0._16_4_;
                            fStack_276c = fVar94 * local_26e0._20_4_;
                            uStack_2764 = auVar109._28_4_;
                            fStack_2768 = fVar107 * local_26e0._24_4_;
                            in_ZMM11 = ZEXT3264(local_2740);
                            auVar8 = vfmsub213ps_fma(local_26e0,local_2740,auVar33);
                            auVar34._4_4_ = auVar76._4_4_ * fVar87;
                            auVar34._0_4_ = auVar76._0_4_ * fVar81;
                            auVar34._8_4_ = auVar76._8_4_ * fVar66;
                            auVar34._12_4_ = auVar76._12_4_ * fVar69;
                            auVar34._16_4_ = auVar76._16_4_ * fVar85;
                            auVar34._20_4_ = auVar76._20_4_ * fVar92;
                            auVar34._24_4_ = auVar76._24_4_ * fVar106;
                            auVar34._28_4_ = uStack_2764;
                            auVar35._4_4_ = auVar192._4_4_ * fVar64;
                            auVar35._0_4_ = auVar192._0_4_ * fVar71;
                            auVar35._8_4_ = auVar192._8_4_ * fVar67;
                            auVar35._12_4_ = auVar192._12_4_ * fVar72;
                            auVar35._16_4_ = auVar192._16_4_ * fVar88;
                            auVar35._20_4_ = auVar192._20_4_ * fVar94;
                            auVar35._24_4_ = auVar192._24_4_ * fVar107;
                            auVar35._28_4_ = auVar110._28_4_;
                            auVar9 = vfmsub213ps_fma(auVar192,local_2700,auVar34);
                            auVar109 = vandps_avx(local_27c0,auVar33);
                            auVar110 = vandps_avx(local_27c0,auVar34);
                            auVar109 = vcmpps_avx(auVar109,auVar110,1);
                            auVar119 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar109);
                            auVar140._0_4_ = auVar193._0_4_ * fVar84;
                            auVar140._4_4_ = auVar193._4_4_ * fVar65;
                            auVar140._8_4_ = auVar193._8_4_ * fVar68;
                            auVar140._12_4_ = auVar193._12_4_ * fVar82;
                            auVar140._16_4_ = auVar193._16_4_ * fVar90;
                            auVar140._20_4_ = auVar193._20_4_ * fVar95;
                            auVar140._24_4_ = auVar193._24_4_ * fVar108;
                            auVar140._28_4_ = 0;
                            auVar8 = vfmsub213ps_fma(auVar193,local_2740,auVar35);
                            auVar196 = ZEXT3264(auVar170);
                            auVar36._4_4_ = fVar87 * local_26a0._4_4_;
                            auVar36._0_4_ = fVar81 * local_26a0._0_4_;
                            auVar36._8_4_ = fVar66 * local_26a0._8_4_;
                            auVar36._12_4_ = fVar69 * local_26a0._12_4_;
                            auVar36._16_4_ = fVar85 * local_26a0._16_4_;
                            auVar36._20_4_ = fVar92 * local_26a0._20_4_;
                            auVar36._24_4_ = fVar106 * local_26a0._24_4_;
                            auVar36._28_4_ = auVar110._28_4_;
                            auVar9 = vfmsub213ps_fma(local_26c0,local_2720,auVar36);
                            auVar109 = vandps_avx(local_27c0,auVar36);
                            auVar110 = vandps_avx(local_27c0,auVar35);
                            auVar109 = vcmpps_avx(auVar109,auVar110,1);
                            auVar192 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9),auVar109);
                            auVar44._4_4_ = fStack_277c;
                            auVar44._0_4_ = local_2780;
                            auVar44._8_4_ = fStack_2778;
                            auVar44._12_4_ = fStack_2774;
                            auVar44._16_4_ = fStack_2770;
                            auVar44._20_4_ = fStack_276c;
                            auVar44._24_4_ = fStack_2768;
                            auVar44._28_4_ = uStack_2764;
                            auVar8 = vfmsub213ps_fma(local_26a0,local_2700,auVar44);
                            auVar9 = vfmsub213ps_fma(auVar76,local_2720,auVar140);
                            in_ZMM12 = ZEXT1664(auVar9);
                            auVar109 = vandps_avx(local_27c0,auVar44);
                            auVar110 = vandps_avx(local_27c0,auVar140);
                            auVar110 = vcmpps_avx(auVar109,auVar110,1);
                            auVar109 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar110);
                            auVar128 = ZEXT3264(auVar109);
                            auVar37._4_4_ = auVar109._4_4_ * fVar116;
                            auVar37._0_4_ = auVar109._0_4_ * fVar115;
                            auVar37._8_4_ = auVar109._8_4_ * fVar117;
                            auVar37._12_4_ = auVar109._12_4_ * fVar118;
                            auVar37._16_4_ = auVar109._16_4_ * fVar129;
                            auVar37._20_4_ = auVar109._20_4_ * fVar130;
                            auVar37._24_4_ = auVar109._24_4_ * fVar131;
                            auVar37._28_4_ = auVar110._28_4_;
                            auVar8 = vfmadd213ps_fma(auVar77,auVar192,auVar37);
                            auVar8 = vfmadd213ps_fma(auVar73,auVar119,ZEXT1632(auVar8));
                            fVar71 = auVar8._0_4_ + auVar8._0_4_;
                            fVar81 = auVar8._4_4_ + auVar8._4_4_;
                            fVar84 = auVar8._8_4_ + auVar8._8_4_;
                            fVar87 = auVar8._12_4_ + auVar8._12_4_;
                            auVar76 = ZEXT1632(CONCAT412(fVar87,CONCAT48(fVar84,CONCAT44(fVar81,
                                                  fVar71))));
                            auVar141._0_4_ = auVar109._0_4_ * fVar132;
                            auVar141._4_4_ = auVar109._4_4_ * fVar133;
                            auVar141._8_4_ = auVar109._8_4_ * fVar134;
                            auVar141._12_4_ = auVar109._12_4_ * fVar135;
                            auVar141._16_4_ = auVar109._16_4_ * fVar144;
                            auVar141._20_4_ = auVar109._20_4_ * fVar145;
                            auVar141._24_4_ = auVar109._24_4_ * fVar146;
                            auVar141._28_4_ = 0;
                            auVar8 = vfmadd213ps_fma(local_2660,auVar192,auVar141);
                            auVar9 = vfmadd213ps_fma(local_2640,auVar119,ZEXT1632(auVar8));
                            auVar77 = vrcpps_avx(auVar76);
                            auVar238._8_4_ = 0x3f800000;
                            auVar238._0_8_ = &DAT_3f8000003f800000;
                            auVar238._12_4_ = 0x3f800000;
                            auVar238._16_4_ = 0x3f800000;
                            auVar238._20_4_ = 0x3f800000;
                            auVar238._24_4_ = 0x3f800000;
                            auVar238._28_4_ = 0x3f800000;
                            auVar240 = ZEXT3264(auVar238);
                            auVar8 = vfnmadd213ps_fma(auVar77,auVar76,auVar238);
                            auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar77,auVar77);
                            auVar110 = ZEXT1632(CONCAT412(auVar8._12_4_ *
                                                          (auVar9._12_4_ + auVar9._12_4_),
                                                          CONCAT48(auVar8._8_4_ *
                                                                   (auVar9._8_4_ + auVar9._8_4_),
                                                                   CONCAT44(auVar8._4_4_ *
                                                                            (auVar9._4_4_ +
                                                                            auVar9._4_4_),
                                                                            auVar8._0_4_ *
                                                                            (auVar9._0_4_ +
                                                                            auVar9._0_4_)))));
                            auVar143 = ZEXT3264(auVar110);
                            auVar77 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar110,2);
                            auVar73 = vcmpps_avx(auVar110,*(undefined1 (*) [32])(ray + 0x100),2);
                            auVar77 = vandps_avx(auVar73,auVar77);
                            auVar171 = ZEXT3264(auVar77);
                            auVar182._0_8_ = CONCAT44(fVar81,fVar71) ^ 0x8000000080000000;
                            auVar182._8_4_ = -fVar84;
                            auVar182._12_4_ = -fVar87;
                            auVar182._16_4_ = 0x80000000;
                            auVar182._20_4_ = 0x80000000;
                            auVar182._24_4_ = 0x80000000;
                            auVar182._28_4_ = 0x80000000;
                            auVar184 = ZEXT3264(auVar182);
                            auVar73 = vcmpps_avx(auVar182,auVar76,4);
                            auVar77 = vandps_avx(auVar73,auVar77);
                            auVar77 = vpslld_avx2(auVar77,0x1f);
                            auVar73 = vpsrad_avx2(auVar77,0x1f);
                            auVar77 = auVar58 & auVar73;
                            auVar58 = vandps_avx(auVar73,auVar58);
                            if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar77 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar77 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar77 >> 0x7f,0) != '\0') ||
                                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar77 >> 0xbf,0) != '\0') ||
                                (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar77[0x1f] < '\0') {
                              _local_27e0 = auVar63;
                              _local_2800 = ZEXT1632(auVar6);
                              local_27a0._8_8_ = auVar136._8_8_;
                              local_2820 = auVar136._0_8_;
                              uStack_2818 = local_27a0._8_8_;
                              uStack_2810 = 0;
                              uStack_2808 = 0;
                              local_2840 = auVar110;
                              local_2860 = auVar119;
                              local_2880 = auVar192;
                              local_28a0 = auVar109;
                            }
                          }
                          uVar49 = *(uint *)((long)&local_2bb0 + uVar46 * 4);
                          pRVar50 = (RTCIntersectArguments *)(ulong)uVar49;
                          pGVar3 = pRVar2[(long)pRVar50].ptr;
                          uVar55 = pGVar3->mask;
                          auVar62._4_4_ = uVar55;
                          auVar62._0_4_ = uVar55;
                          auVar62._8_4_ = uVar55;
                          auVar62._12_4_ = uVar55;
                          auVar62._16_4_ = uVar55;
                          auVar62._20_4_ = uVar55;
                          auVar62._24_4_ = uVar55;
                          auVar62._28_4_ = uVar55;
                          auVar77 = vpand_avx2(auVar62,*(undefined1 (*) [32])(ray + 0x120));
                          auVar73 = vpcmpeqd_avx2(auVar77,_DAT_02020f00);
                          auVar77 = auVar58 & ~auVar73;
                          if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar77 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar77 >> 0x7f,0) == '\0') &&
                                (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar77 >> 0xbf,0) == '\0') &&
                              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar77[0x1f]) {
                            auVar79 = ZEXT3264(local_2c20);
                            auVar73 = local_2c00;
                          }
                          else {
                            uVar48 = *(undefined4 *)((long)&local_2bc0 + uVar46 * 4);
                            auVar77 = vandnps_avx(auVar73,auVar58);
                            if ((local_2d28->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                              auVar79 = ZEXT3264(local_2c20);
                            }
                            else {
                              auVar43._8_8_ = uStack_2818;
                              auVar43._0_8_ = local_2820;
                              auVar43._16_8_ = uStack_2810;
                              auVar43._24_8_ = uStack_2808;
                              auVar73 = vandps_avx(local_27c0,auVar43);
                              auVar58 = vrcpps_avx(auVar43);
                              auVar109 = auVar240._0_32_;
                              auVar8 = vfnmadd213ps_fma(auVar58,auVar43,auVar109);
                              auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar58,auVar58);
                              auVar101._8_4_ = 0x219392ef;
                              auVar101._0_8_ = 0x219392ef219392ef;
                              auVar101._12_4_ = 0x219392ef;
                              auVar101._16_4_ = 0x219392ef;
                              auVar101._20_4_ = 0x219392ef;
                              auVar101._24_4_ = 0x219392ef;
                              auVar101._28_4_ = 0x219392ef;
                              auVar73 = vcmpps_avx(auVar73,auVar101,5);
                              auVar73 = vandps_avx(auVar73,ZEXT1632(auVar8));
                              auVar38._4_4_ = auVar73._4_4_ * (float)local_27e0._4_4_;
                              auVar38._0_4_ = auVar73._0_4_ * (float)local_27e0._0_4_;
                              auVar38._8_4_ = auVar73._8_4_ * fStack_27d8;
                              auVar38._12_4_ = auVar73._12_4_ * fStack_27d4;
                              auVar38._16_4_ = auVar73._16_4_ * fStack_27d0;
                              auVar38._20_4_ = auVar73._20_4_ * fStack_27cc;
                              auVar38._24_4_ = auVar73._24_4_ * fStack_27c8;
                              auVar38._28_4_ = 0x219392ef;
                              local_2b40 = vminps_avx(auVar38,auVar109);
                              auVar39._4_4_ = auVar73._4_4_ * (float)local_2800._4_4_;
                              auVar39._0_4_ = auVar73._0_4_ * (float)local_2800._0_4_;
                              auVar39._8_4_ = auVar73._8_4_ * fStack_27f8;
                              auVar39._12_4_ = auVar73._12_4_ * fStack_27f4;
                              auVar39._16_4_ = auVar73._16_4_ * fStack_27f0;
                              auVar39._20_4_ = auVar73._20_4_ * fStack_27ec;
                              auVar39._24_4_ = auVar73._24_4_ * fStack_27e8;
                              auVar39._28_4_ = auVar73._28_4_;
                              local_2b20 = vminps_avx(auVar39,auVar109);
                              local_2ba0 = local_2860._0_8_;
                              uStack_2b98 = local_2860._8_8_;
                              uStack_2b90 = local_2860._16_8_;
                              uStack_2b88 = local_2860._24_8_;
                              local_2b80 = local_2880._0_8_;
                              uStack_2b78 = local_2880._8_8_;
                              uStack_2b70 = local_2880._16_8_;
                              uStack_2b68 = local_2880._24_8_;
                              auVar143 = ZEXT3264(local_28a0);
                              _local_2b60 = local_28a0;
                              local_2b00 = uVar48;
                              uStack_2afc = uVar48;
                              uStack_2af8 = uVar48;
                              uStack_2af4 = uVar48;
                              uStack_2af0 = uVar48;
                              uStack_2aec = uVar48;
                              uStack_2ae8 = uVar48;
                              uStack_2ae4 = uVar48;
                              local_2ae0 = uVar49;
                              uStack_2adc = uVar49;
                              uStack_2ad8 = uVar49;
                              uStack_2ad4 = uVar49;
                              uStack_2ad0 = uVar49;
                              uStack_2acc = uVar49;
                              uStack_2ac8 = uVar49;
                              uStack_2ac4 = uVar49;
                              vpcmpeqd_avx2(local_2b20,local_2b20);
                              local_2ac0._4_4_ = local_2d28->user->instID[0];
                              local_2ac0._0_4_ = local_2ac0._4_4_;
                              local_2ac0._8_4_ = local_2ac0._4_4_;
                              local_2ac0._12_4_ = local_2ac0._4_4_;
                              local_2ac0._16_4_ = local_2ac0._4_4_;
                              local_2ac0._20_4_ = local_2ac0._4_4_;
                              local_2ac0._24_4_ = local_2ac0._4_4_;
                              local_2ac0._28_4_ = local_2ac0._4_4_;
                              local_2aa0._4_4_ = local_2d28->user->instPrimID[0];
                              local_2aa0._0_4_ = local_2aa0._4_4_;
                              local_2aa0._8_4_ = local_2aa0._4_4_;
                              local_2aa0._12_4_ = local_2aa0._4_4_;
                              local_2aa0._16_4_ = local_2aa0._4_4_;
                              local_2aa0._20_4_ = local_2aa0._4_4_;
                              local_2aa0._24_4_ = local_2aa0._4_4_;
                              local_2aa0._28_4_ = local_2aa0._4_4_;
                              local_2d00 = *(undefined1 (*) [32])(ray + 0x100);
                              auVar73 = vblendvps_avx(local_2d00,local_2840,auVar77);
                              *(undefined1 (*) [32])(ray + 0x100) = auVar73;
                              local_2ce0 = auVar77;
                              local_2cc0 = (undefined1  [8])local_2ce0;
                              uStack_2cb8 = pGVar3->userPtr;
                              uStack_2cb0 = local_2d28->user;
                              pRStack_2ca8 = ray;
                              local_2ca0 = (RTCHitN *)&local_2ba0;
                              fStack_2c98 = 1.12104e-44;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar143 = ZEXT1664(local_28a0._0_16_);
                                auVar158 = ZEXT1664(auVar6);
                                auVar171 = ZEXT1664(auVar171._0_16_);
                                auVar184 = ZEXT1664(auVar184._0_16_);
                                auVar196 = ZEXT1664(auVar196._0_16_);
                                auVar205 = ZEXT1664(local_27c0._0_16_);
                                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                in_ZMM13 = ZEXT1664(auVar96);
                                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                (*pGVar3->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_2cc0);
                                auVar79._8_56_ = extraout_var;
                                auVar79._0_8_ = extraout_XMM1_Qa;
                                auVar73 = auVar79._0_32_;
                                auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                                              CONCAT424(0x3f800000,
                                                                        CONCAT420(0x3f800000,
                                                                                  CONCAT416(
                                                  0x3f800000,
                                                  CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)))))));
                              }
                              auVar128 = ZEXT3264(local_2d00);
                              auVar77 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ce0);
                              auVar58 = vpcmpeqd_avx2(auVar73,auVar73);
                              auVar73 = auVar58 & ~auVar77;
                              if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar73 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar73 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar73 >> 0x7f,0) == '\0')
                                    && (auVar73 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar73 >> 0xbf,0) == '\0')
                                  && (auVar73 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar73[0x1f]) {
                                auVar77 = auVar77 ^ auVar58;
                                auVar79 = ZEXT3264(local_2c20);
                              }
                              else {
                                pRVar50 = local_2d28->args;
                                auVar79 = ZEXT3264(local_2c20);
                                if ((pRVar50->filter != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar50->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar143 = ZEXT1664(auVar143._0_16_);
                                  auVar158 = ZEXT1664(auVar158._0_16_);
                                  auVar171 = ZEXT1664(auVar171._0_16_);
                                  auVar184 = ZEXT1664(auVar184._0_16_);
                                  auVar196 = ZEXT1664(auVar196._0_16_);
                                  auVar205 = ZEXT1664(auVar205._0_16_);
                                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  (*pRVar50->filter)((RTCFilterFunctionNArguments *)local_2cc0);
                                  auVar128 = ZEXT3264(local_2d00);
                                  auVar79 = ZEXT3264(local_2c20);
                                  auVar240 = ZEXT3264(CONCAT428(0x3f800000,
                                                                CONCAT424(0x3f800000,
                                                                          CONCAT420(0x3f800000,
                                                                                    CONCAT416(
                                                  0x3f800000,
                                                  CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)))))));
                                }
                                auVar73 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                        local_2ce0);
                                auVar77 = auVar73 ^ _DAT_0205a980;
                                auVar103._8_4_ = 0xff800000;
                                auVar103._0_8_ = 0xff800000ff800000;
                                auVar103._12_4_ = 0xff800000;
                                auVar103._16_4_ = 0xff800000;
                                auVar103._20_4_ = 0xff800000;
                                auVar103._24_4_ = 0xff800000;
                                auVar103._28_4_ = 0xff800000;
                                auVar73 = vblendvps_avx(auVar103,*(undefined1 (*) [32])
                                                                  (pRStack_2ca8 + 0x100),auVar73);
                                *(undefined1 (*) [32])(pRStack_2ca8 + 0x100) = auVar73;
                              }
                              auVar73 = vblendvps_avx(auVar128._0_32_,
                                                      *(undefined1 (*) [32])local_2d10,auVar77);
                              *(undefined1 (*) [32])local_2d10 = auVar73;
                            }
                            auVar73 = vandnps_avx(auVar77,local_2c00);
                          }
                          auVar58 = auVar79._0_32_;
                          if (((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0 &&
                                    (auVar73 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar73 >> 0x5f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) && SUB321(auVar73 >> 0x7f,0) == '\0') &&
                                 (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && SUB321(auVar73 >> 0xbf,0) == '\0') &&
                               (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && -1 < auVar73[0x1f]) ||
                             (bVar57 = 2 < uVar46, uVar46 = uVar46 + 1, bVar57)) break;
                        }
                        auVar77 = vandps_avx(auVar73,auVar58);
                        auVar58 = auVar58 & auVar73;
                      } while (((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar58 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar58 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar58 >> 0x7f,0) != '\0') ||
                                  (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar58 >> 0xbf,0) != '\0') ||
                                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar58[0x1f] < '\0') &&
                              (uVar47 = local_2d08 + 1, uVar47 < local_2c50));
                      auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                      auVar79 = ZEXT3264(auVar73);
                      auVar63._0_4_ = auVar77._0_4_ ^ auVar73._0_4_;
                      auVar63._4_4_ = auVar77._4_4_ ^ auVar73._4_4_;
                      auVar63._8_4_ = auVar77._8_4_ ^ auVar73._8_4_;
                      auVar63._12_4_ = auVar77._12_4_ ^ auVar73._12_4_;
                      auVar63._16_4_ = auVar77._16_4_ ^ auVar73._16_4_;
                      auVar63._20_4_ = auVar77._20_4_ ^ auVar73._20_4_;
                      auVar63._24_4_ = auVar77._24_4_ ^ auVar73._24_4_;
                      auVar63._28_4_ = auVar77._28_4_ ^ auVar73._28_4_;
                    }
                    local_2c40 = vorps_avx(auVar63,local_2c40);
                    auVar77 = auVar79._0_32_ & ~local_2c40;
                    if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar77 >> 0x7f,0) == '\0') &&
                          (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar77 >> 0xbf,0) == '\0') &&
                        (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar77[0x1f]) goto LAB_005b22af;
                    auVar79 = ZEXT3264(local_28e0);
                    auVar104._8_4_ = 0xff800000;
                    auVar104._0_8_ = 0xff800000ff800000;
                    auVar104._12_4_ = 0xff800000;
                    auVar104._16_4_ = 0xff800000;
                    auVar104._20_4_ = 0xff800000;
                    auVar104._24_4_ = 0xff800000;
                    auVar104._28_4_ = 0xff800000;
                    local_28e0 = vblendvps_avx(local_28e0,auVar104,local_2c40);
                    iVar45 = 0;
                    break;
                  }
                  goto LAB_005b22c0;
                }
                uVar46 = root.ptr & 0xfffffffffffffff0;
                auVar77 = vcmpps_avx(local_28e0,auVar240._0_32_,6);
                auVar240 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar47 = 0;
                root.ptr = 8;
                do {
                  uVar52 = *(ulong *)(uVar46 + uVar47 * 8);
                  if (uVar52 != 8) {
                    uVar48 = *(undefined4 *)(uVar46 + 0x80 + uVar47 * 4);
                    auVar97._4_4_ = uVar48;
                    auVar97._0_4_ = uVar48;
                    auVar97._8_4_ = uVar48;
                    auVar97._12_4_ = uVar48;
                    auVar97._16_4_ = uVar48;
                    auVar97._20_4_ = uVar48;
                    auVar97._24_4_ = uVar48;
                    auVar97._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0x20 + uVar47 * 4);
                    auVar111._4_4_ = uVar48;
                    auVar111._0_4_ = uVar48;
                    auVar111._8_4_ = uVar48;
                    auVar111._12_4_ = uVar48;
                    auVar111._16_4_ = uVar48;
                    auVar111._20_4_ = uVar48;
                    auVar111._24_4_ = uVar48;
                    auVar111._28_4_ = uVar48;
                    auVar73 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar48 = *(undefined4 *)(uVar46 + 0xa0 + uVar47 * 4);
                    auVar120._4_4_ = uVar48;
                    auVar120._0_4_ = uVar48;
                    auVar120._8_4_ = uVar48;
                    auVar120._12_4_ = uVar48;
                    auVar120._16_4_ = uVar48;
                    auVar120._20_4_ = uVar48;
                    auVar120._24_4_ = uVar48;
                    auVar120._28_4_ = uVar48;
                    auVar96 = vfmadd231ps_fma(auVar111,auVar73,auVar97);
                    uVar48 = *(undefined4 *)(uVar46 + 0x40 + uVar47 * 4);
                    auVar98._4_4_ = uVar48;
                    auVar98._0_4_ = uVar48;
                    auVar98._8_4_ = uVar48;
                    auVar98._12_4_ = uVar48;
                    auVar98._16_4_ = uVar48;
                    auVar98._20_4_ = uVar48;
                    auVar98._24_4_ = uVar48;
                    auVar98._28_4_ = uVar48;
                    auVar6 = vfmadd231ps_fma(auVar98,auVar73,auVar120);
                    uVar48 = *(undefined4 *)(uVar46 + 0xc0 + uVar47 * 4);
                    auVar121._4_4_ = uVar48;
                    auVar121._0_4_ = uVar48;
                    auVar121._8_4_ = uVar48;
                    auVar121._12_4_ = uVar48;
                    auVar121._16_4_ = uVar48;
                    auVar121._20_4_ = uVar48;
                    auVar121._24_4_ = uVar48;
                    auVar121._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0x60 + uVar47 * 4);
                    auVar137._4_4_ = uVar48;
                    auVar137._0_4_ = uVar48;
                    auVar137._8_4_ = uVar48;
                    auVar137._12_4_ = uVar48;
                    auVar137._16_4_ = uVar48;
                    auVar137._20_4_ = uVar48;
                    auVar137._24_4_ = uVar48;
                    auVar137._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0x90 + uVar47 * 4);
                    auVar151._4_4_ = uVar48;
                    auVar151._0_4_ = uVar48;
                    auVar151._8_4_ = uVar48;
                    auVar151._12_4_ = uVar48;
                    auVar151._16_4_ = uVar48;
                    auVar151._20_4_ = uVar48;
                    auVar151._24_4_ = uVar48;
                    auVar151._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0x30 + uVar47 * 4);
                    auVar166._4_4_ = uVar48;
                    auVar166._0_4_ = uVar48;
                    auVar166._8_4_ = uVar48;
                    auVar166._12_4_ = uVar48;
                    auVar166._16_4_ = uVar48;
                    auVar166._20_4_ = uVar48;
                    auVar166._24_4_ = uVar48;
                    auVar166._28_4_ = uVar48;
                    auVar8 = vfmadd231ps_fma(auVar137,auVar73,auVar121);
                    auVar136 = vfmadd231ps_fma(auVar166,auVar73,auVar151);
                    uVar48 = *(undefined4 *)(uVar46 + 0xb0 + uVar47 * 4);
                    auVar122._4_4_ = uVar48;
                    auVar122._0_4_ = uVar48;
                    auVar122._8_4_ = uVar48;
                    auVar122._12_4_ = uVar48;
                    auVar122._16_4_ = uVar48;
                    auVar122._20_4_ = uVar48;
                    auVar122._24_4_ = uVar48;
                    auVar122._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0x50 + uVar47 * 4);
                    auVar152._4_4_ = uVar48;
                    auVar152._0_4_ = uVar48;
                    auVar152._8_4_ = uVar48;
                    auVar152._12_4_ = uVar48;
                    auVar152._16_4_ = uVar48;
                    auVar152._20_4_ = uVar48;
                    auVar152._24_4_ = uVar48;
                    auVar152._28_4_ = uVar48;
                    uVar48 = *(undefined4 *)(uVar46 + 0xd0 + uVar47 * 4);
                    auVar179._4_4_ = uVar48;
                    auVar179._0_4_ = uVar48;
                    auVar179._8_4_ = uVar48;
                    auVar179._12_4_ = uVar48;
                    auVar179._16_4_ = uVar48;
                    auVar179._20_4_ = uVar48;
                    auVar179._24_4_ = uVar48;
                    auVar179._28_4_ = uVar48;
                    auVar9 = vfmadd231ps_fma(auVar152,auVar73,auVar122);
                    uVar48 = *(undefined4 *)(uVar46 + 0x70 + uVar47 * 4);
                    auVar123._4_4_ = uVar48;
                    auVar123._0_4_ = uVar48;
                    auVar123._8_4_ = uVar48;
                    auVar123._12_4_ = uVar48;
                    auVar123._16_4_ = uVar48;
                    auVar123._20_4_ = uVar48;
                    auVar123._24_4_ = uVar48;
                    auVar123._28_4_ = uVar48;
                    auVar10 = vfmadd231ps_fma(auVar123,auVar73,auVar179);
                    auVar40._8_8_ = local_2a80._8_8_;
                    auVar40._0_8_ = local_2a80._0_8_;
                    auVar40._16_8_ = local_2a80._16_8_;
                    auVar40._24_8_ = local_2a80._24_8_;
                    auVar184 = ZEXT3264(auVar40);
                    auVar41._8_8_ = local_2a80._40_8_;
                    auVar41._0_8_ = local_2a80._32_8_;
                    auVar41._16_8_ = local_2a80._48_8_;
                    auVar41._24_8_ = local_2a80._56_8_;
                    auVar196 = ZEXT3264(auVar41);
                    auVar42._8_8_ = local_2a80._72_8_;
                    auVar42._0_8_ = local_2a80._64_8_;
                    auVar42._16_8_ = local_2a80._80_8_;
                    auVar42._24_8_ = local_2a80._88_8_;
                    auVar205 = ZEXT3264(auVar42);
                    in_ZMM11 = ZEXT3264(local_29c0);
                    auVar58 = vsubps_avx(ZEXT1632(auVar96),auVar40);
                    auVar11._4_4_ = local_29c0._4_4_ * auVar58._4_4_;
                    auVar11._0_4_ = local_29c0._0_4_ * auVar58._0_4_;
                    auVar11._8_4_ = local_29c0._8_4_ * auVar58._8_4_;
                    auVar11._12_4_ = local_29c0._12_4_ * auVar58._12_4_;
                    auVar11._16_4_ = local_29c0._16_4_ * auVar58._16_4_;
                    auVar11._20_4_ = local_29c0._20_4_ * auVar58._20_4_;
                    auVar11._24_4_ = local_29c0._24_4_ * auVar58._24_4_;
                    auVar11._28_4_ = auVar58._28_4_;
                    auVar58 = vsubps_avx(ZEXT1632(auVar6),auVar41);
                    in_ZMM12 = ZEXT3264(local_29a0);
                    auVar171._0_4_ = local_29a0._0_4_ * auVar58._0_4_;
                    auVar171._4_4_ = local_29a0._4_4_ * auVar58._4_4_;
                    auVar171._8_4_ = local_29a0._8_4_ * auVar58._8_4_;
                    auVar171._12_4_ = local_29a0._12_4_ * auVar58._12_4_;
                    auVar171._16_4_ = local_29a0._16_4_ * auVar58._16_4_;
                    auVar171._20_4_ = local_29a0._20_4_ * auVar58._20_4_;
                    auVar171._28_36_ = in_ZMM13._28_36_;
                    auVar171._24_4_ = local_29a0._24_4_ * auVar58._24_4_;
                    auVar110 = auVar171._0_32_;
                    in_ZMM13 = ZEXT3264(auVar110);
                    auVar58 = vsubps_avx(ZEXT1632(auVar8),auVar42);
                    auVar235._0_4_ = auVar58._0_4_ * (float)local_2980._0_4_;
                    auVar235._4_4_ = auVar58._4_4_ * (float)local_2980._4_4_;
                    auVar235._8_4_ = auVar58._8_4_ * fStack_2978;
                    auVar235._12_4_ = auVar58._12_4_ * fStack_2974;
                    auVar235._16_4_ = auVar58._16_4_ * fStack_2970;
                    auVar235._20_4_ = auVar58._20_4_ * fStack_296c;
                    auVar235._28_36_ = in_ZMM14._28_36_;
                    auVar235._24_4_ = auVar58._24_4_ * fStack_2968;
                    auVar119 = auVar235._0_32_;
                    in_ZMM14 = ZEXT3264(auVar119);
                    auVar58 = vsubps_avx(ZEXT1632(auVar136),auVar40);
                    auVar167._0_4_ = local_29c0._0_4_ * auVar58._0_4_;
                    auVar167._4_4_ = local_29c0._4_4_ * auVar58._4_4_;
                    auVar167._8_4_ = local_29c0._8_4_ * auVar58._8_4_;
                    auVar167._12_4_ = local_29c0._12_4_ * auVar58._12_4_;
                    auVar167._16_4_ = local_29c0._16_4_ * auVar58._16_4_;
                    auVar167._20_4_ = local_29c0._20_4_ * auVar58._20_4_;
                    auVar167._24_4_ = local_29c0._24_4_ * auVar58._24_4_;
                    auVar167._28_4_ = 0;
                    auVar171 = ZEXT3264(auVar167);
                    auVar58 = vsubps_avx(ZEXT1632(auVar9),auVar41);
                    auVar153._0_4_ = local_29a0._0_4_ * auVar58._0_4_;
                    auVar153._4_4_ = local_29a0._4_4_ * auVar58._4_4_;
                    auVar153._8_4_ = local_29a0._8_4_ * auVar58._8_4_;
                    auVar153._12_4_ = local_29a0._12_4_ * auVar58._12_4_;
                    auVar153._16_4_ = local_29a0._16_4_ * auVar58._16_4_;
                    auVar153._20_4_ = local_29a0._20_4_ * auVar58._20_4_;
                    auVar153._24_4_ = local_29a0._24_4_ * auVar58._24_4_;
                    auVar153._28_4_ = 0;
                    auVar158 = ZEXT3264(auVar153);
                    auVar58 = vsubps_avx(ZEXT1632(auVar10),auVar42);
                    auVar124._0_4_ = auVar58._0_4_ * (float)local_2980._0_4_;
                    auVar124._4_4_ = auVar58._4_4_ * (float)local_2980._4_4_;
                    auVar124._8_4_ = auVar58._8_4_ * fStack_2978;
                    auVar124._12_4_ = auVar58._12_4_ * fStack_2974;
                    auVar124._16_4_ = auVar58._16_4_ * fStack_2970;
                    auVar124._20_4_ = auVar58._20_4_ * fStack_296c;
                    auVar124._24_4_ = auVar58._24_4_ * fStack_2968;
                    auVar124._28_4_ = 0;
                    auVar58 = vpminsd_avx2(auVar11,auVar167);
                    auVar109 = vpminsd_avx2(auVar110,auVar153);
                    auVar58 = vpmaxsd_avx2(auVar58,auVar109);
                    auVar109 = vpminsd_avx2(auVar119,auVar124);
                    auVar58 = vpmaxsd_avx2(auVar58,auVar109);
                    auVar12._4_4_ = auVar58._4_4_ * 0.99999964;
                    auVar12._0_4_ = auVar58._0_4_ * 0.99999964;
                    auVar12._8_4_ = auVar58._8_4_ * 0.99999964;
                    auVar12._12_4_ = auVar58._12_4_ * 0.99999964;
                    auVar12._16_4_ = auVar58._16_4_ * 0.99999964;
                    auVar12._20_4_ = auVar58._20_4_ * 0.99999964;
                    auVar12._24_4_ = auVar58._24_4_ * 0.99999964;
                    auVar12._28_4_ = auVar58._28_4_;
                    auVar58 = vpmaxsd_avx2(auVar11,auVar167);
                    auVar138 = vpmaxsd_avx2(auVar110,auVar153);
                    auVar109 = vpminsd_avx2(auVar58,auVar138);
                    auVar58 = vpmaxsd_avx2(auVar119,auVar124);
                    auVar58 = vpminsd_avx2(auVar109,auVar58);
                    auVar13._4_4_ = auVar58._4_4_ * 1.0000004;
                    auVar13._0_4_ = auVar58._0_4_ * 1.0000004;
                    auVar13._8_4_ = auVar58._8_4_ * 1.0000004;
                    auVar13._12_4_ = auVar58._12_4_ * 1.0000004;
                    auVar13._16_4_ = auVar58._16_4_ * 1.0000004;
                    auVar13._20_4_ = auVar58._20_4_ * 1.0000004;
                    auVar13._24_4_ = auVar58._24_4_ * 1.0000004;
                    auVar13._28_4_ = auVar58._28_4_;
                    auVar109 = vpmaxsd_avx2(auVar12,local_2900);
                    auVar58 = vpminsd_avx2(auVar13,local_28e0);
                    auVar58 = vcmpps_avx(auVar109,auVar58,2);
                    if ((uVar55 & 7) == 6) {
                      uVar48 = *(undefined4 *)(uVar46 + 0xe0 + uVar47 * 4);
                      auVar125._4_4_ = uVar48;
                      auVar125._0_4_ = uVar48;
                      auVar125._8_4_ = uVar48;
                      auVar125._12_4_ = uVar48;
                      auVar125._16_4_ = uVar48;
                      auVar125._20_4_ = uVar48;
                      auVar125._24_4_ = uVar48;
                      auVar125._28_4_ = uVar48;
                      auVar109 = vcmpps_avx(auVar125,auVar73,2);
                      uVar48 = *(undefined4 *)(uVar46 + 0xf0 + uVar47 * 4);
                      auVar138._4_4_ = uVar48;
                      auVar138._0_4_ = uVar48;
                      auVar138._8_4_ = uVar48;
                      auVar138._12_4_ = uVar48;
                      auVar138._16_4_ = uVar48;
                      auVar138._20_4_ = uVar48;
                      auVar138._24_4_ = uVar48;
                      auVar138._28_4_ = uVar48;
                      auVar73 = vcmpps_avx(auVar73,auVar138,1);
                      auVar73 = vandps_avx(auVar109,auVar73);
                      auVar73 = vandps_avx(auVar73,auVar58);
                      auVar96 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
                    }
                    else {
                      auVar96 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
                    }
                    auVar143 = ZEXT3264(auVar138);
                    auVar128 = ZEXT3264(auVar109);
                    auVar6 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
                    auVar96 = vpand_avx(auVar96,auVar6);
                    auVar73 = vpmovzxwd_avx2(auVar96);
                    auVar73 = vpslld_avx2(auVar73,0x1f);
                    auVar79 = ZEXT3264(auVar73);
                    if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar73 >> 0x7f,0) != '\0') ||
                          (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar73 >> 0xbf,0) != '\0') ||
                        (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar73[0x1f] < '\0') {
                      auVar112._8_4_ = 0x7f800000;
                      auVar112._0_8_ = 0x7f8000007f800000;
                      auVar112._12_4_ = 0x7f800000;
                      auVar112._16_4_ = 0x7f800000;
                      auVar112._20_4_ = 0x7f800000;
                      auVar112._24_4_ = 0x7f800000;
                      auVar112._28_4_ = 0x7f800000;
                      auVar73 = vblendvps_avx(auVar112,auVar12,auVar73);
                      auVar79 = ZEXT3264(auVar73);
                      if (root.ptr != 8) {
                        *puVar54 = root.ptr;
                        puVar54 = puVar54 + 1;
                        *pauVar51 = auVar240._0_32_;
                        pauVar51 = pauVar51 + 1;
                      }
                      auVar240 = ZEXT3264(auVar73);
                      root.ptr = uVar52;
                    }
                  }
                } while ((uVar52 != 8) && (bVar57 = uVar47 < 3, uVar47 = uVar47 + 1, bVar57));
                iVar45 = 0;
                if (root.ptr == 8) {
LAB_005b15ef:
                  pRVar50 = (RTCIntersectArguments *)0x0;
                  iVar45 = 4;
                }
                else {
                  auVar77 = vcmpps_avx(local_28e0,auVar240._0_32_,6);
                  uVar48 = vmovmskps_avx(auVar77);
                  pRVar50 = (RTCIntersectArguments *)0x1;
                  if ((uint)POPCOUNT(uVar48) <= (uint)uVar53) {
                    *puVar54 = root.ptr;
                    puVar54 = puVar54 + 1;
                    *pauVar51 = auVar240._0_32_;
                    pauVar51 = pauVar51 + 1;
                    goto LAB_005b15ef;
                  }
                }
              } while ((char)pRVar50 != '\0');
            }
          }
        }
      } while (iVar45 != 3);
      auVar77 = vandps_avx(local_28c0,local_2c40);
      auVar78._8_4_ = 0xff800000;
      auVar78._0_8_ = 0xff800000ff800000;
      auVar78._12_4_ = 0xff800000;
      auVar78._16_4_ = 0xff800000;
      auVar78._20_4_ = 0xff800000;
      auVar78._24_4_ = 0xff800000;
      auVar78._28_4_ = 0xff800000;
      auVar77 = vmaskmovps_avx(auVar77,auVar78);
      *(undefined1 (*) [32])local_2d10 = auVar77;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }